

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  _func_int ***ppp_Var1;
  _func_int ***ppp_Var2;
  _func_int ***ppp_Var3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  Primitive *pPVar6;
  float *pfVar7;
  Primitive PVar8;
  undefined4 uVar9;
  int iVar10;
  Geometry *pGVar11;
  long lVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined6 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  int iVar35;
  ulong uVar36;
  undefined1 auVar37 [8];
  undefined1 *puVar38;
  RTCFilterFunctionN p_Var39;
  byte bVar40;
  ulong uVar41;
  long lVar42;
  Geometry *geometry;
  long lVar43;
  Geometry *pGVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  short sVar53;
  float fVar54;
  float fVar83;
  float fVar84;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  float fVar86;
  float fVar97;
  float fVar99;
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar100;
  float fVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  float fVar103;
  float fVar110;
  float fVar112;
  vfloat4 v;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar113;
  float fVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar115;
  float fVar116;
  float fVar124;
  float fVar126;
  vfloat4 v_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar129;
  float fVar141;
  float fVar142;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar143;
  float fVar150;
  float fVar151;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar162;
  float fVar164;
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar167;
  float fVar168;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar195;
  float fVar197;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar196;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  float fVar203;
  float fVar204;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar216;
  float fVar219;
  float fVar222;
  undefined1 auVar214 [16];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar223;
  undefined1 auVar215 [16];
  float fVar224;
  float fVar225;
  float fVar229;
  float fVar231;
  float fVar233;
  undefined1 auVar226 [16];
  float fVar230;
  float fVar232;
  float fVar234;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar235;
  float fVar242;
  float fVar243;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_42c [4];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 local_3f8;
  __int_type_conflict _Stack_3f0;
  undefined1 local_3e8 [16];
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  RayQueryContext *local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  undefined8 uStack_390;
  undefined1 local_388 [8];
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  Precalculations *local_350;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  ulong local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  anon_struct_4_6_abad0318_for_Geometry_10 aStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  RTCFilterFunctionNArguments local_2c8;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  undefined8 uStack_280;
  undefined8 local_278;
  float local_270;
  float local_26c;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  uint local_25c;
  uint local_258;
  ulong local_240;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  uint local_158;
  int local_154;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  __int_type_conflict _Stack_130;
  undefined8 local_128;
  __int_type_conflict _Stack_120;
  _func_int **local_118;
  __int_type_conflict _Stack_110;
  undefined1 local_108 [16];
  float local_f8 [4];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 uVar81;
  undefined2 uVar82;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  
  PVar8 = prim[1];
  uVar36 = (ulong)(byte)PVar8;
  pPVar6 = prim + uVar36 * 0x19 + 6;
  fVar112 = *(float *)(pPVar6 + 0xc);
  fVar115 = ((ray->org).field_0.m128[0] - *(float *)pPVar6) * fVar112;
  fVar124 = ((ray->org).field_0.m128[1] - *(float *)(pPVar6 + 4)) * fVar112;
  fVar126 = ((ray->org).field_0.m128[2] - *(float *)(pPVar6 + 8)) * fVar112;
  fVar102 = fVar112 * (ray->dir).field_0.m128[0];
  fVar110 = fVar112 * (ray->dir).field_0.m128[1];
  fVar112 = fVar112 * (ray->dir).field_0.m128[2];
  uVar9 = *(undefined4 *)(prim + uVar36 * 4 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar46;
  auVar55._12_2_ = uVar82;
  auVar55._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar192._12_4_ = auVar55._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar46;
  auVar192._10_2_ = uVar82;
  auVar65._10_6_ = auVar192._10_6_;
  auVar65._8_2_ = uVar82;
  auVar65._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar16._4_8_ = auVar65._8_8_;
  auVar16._2_2_ = uVar82;
  auVar16._0_2_ = uVar82;
  fVar85 = (float)((int)sVar53 >> 8);
  fVar97 = (float)(auVar16._0_4_ >> 0x18);
  fVar99 = (float)(auVar65._8_4_ >> 0x18);
  uVar9 = *(undefined4 *)(prim + uVar36 * 5 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar46;
  auVar58._12_2_ = uVar82;
  auVar58._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar46;
  auVar57._10_2_ = uVar82;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar82;
  auVar56._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar17._4_8_ = auVar56._8_8_;
  auVar17._2_2_ = uVar82;
  auVar17._0_2_ = uVar82;
  fVar129 = (float)((int)sVar53 >> 8);
  fVar141 = (float)(auVar17._0_4_ >> 0x18);
  fVar142 = (float)(auVar56._8_4_ >> 0x18);
  uVar9 = *(undefined4 *)(prim + uVar36 * 6 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar46;
  auVar61._12_2_ = uVar82;
  auVar61._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar46;
  auVar60._10_2_ = uVar82;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar82;
  auVar59._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar18._4_8_ = auVar59._8_8_;
  auVar18._2_2_ = uVar82;
  auVar18._0_2_ = uVar82;
  fVar143 = (float)((int)sVar53 >> 8);
  fVar150 = (float)(auVar18._0_4_ >> 0x18);
  fVar151 = (float)(auVar59._8_4_ >> 0x18);
  uVar9 = *(undefined4 *)(prim + uVar36 * 0xb + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar46;
  auVar64._12_2_ = uVar82;
  auVar64._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar46;
  auVar63._10_2_ = uVar82;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar82;
  auVar62._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar19._4_8_ = auVar62._8_8_;
  auVar19._2_2_ = uVar82;
  auVar19._0_2_ = uVar82;
  fVar54 = (float)((int)sVar53 >> 8);
  fVar83 = (float)(auVar19._0_4_ >> 0x18);
  fVar84 = (float)(auVar62._8_4_ >> 0x18);
  uVar9 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar46;
  auVar155._12_2_ = uVar82;
  auVar155._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar46;
  auVar154._10_2_ = uVar82;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar82;
  auVar153._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar20._4_8_ = auVar153._8_8_;
  auVar20._2_2_ = uVar82;
  auVar20._0_2_ = uVar82;
  fVar152 = (float)((int)sVar53 >> 8);
  fVar162 = (float)(auVar20._0_4_ >> 0x18);
  fVar164 = (float)(auVar153._8_4_ >> 0x18);
  uVar9 = *(undefined4 *)(prim + (uint)(byte)PVar8 * 0xc + uVar36 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar46;
  auVar171._12_2_ = uVar82;
  auVar171._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar46;
  auVar170._10_2_ = uVar82;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar82;
  auVar169._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar21._4_8_ = auVar169._8_8_;
  auVar21._2_2_ = uVar82;
  auVar21._0_2_ = uVar82;
  fVar200 = (float)((int)sVar53 >> 8);
  fVar203 = (float)(auVar21._0_4_ >> 0x18);
  fVar204 = (float)(auVar169._8_4_ >> 0x18);
  uVar45 = (ulong)(uint)((int)(uVar36 * 9) * 2);
  uVar9 = *(undefined4 *)(prim + uVar45 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar46;
  auVar174._12_2_ = uVar82;
  auVar174._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar46;
  auVar173._10_2_ = uVar82;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar82;
  auVar172._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar22._4_8_ = auVar172._8_8_;
  auVar22._2_2_ = uVar82;
  auVar22._0_2_ = uVar82;
  fVar188 = (float)((int)sVar53 >> 8);
  fVar195 = (float)(auVar22._0_4_ >> 0x18);
  fVar197 = (float)(auVar172._8_4_ >> 0x18);
  uVar9 = *(undefined4 *)(prim + uVar45 + uVar36 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar46;
  auVar177._12_2_ = uVar82;
  auVar177._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar46;
  auVar176._10_2_ = uVar82;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar82;
  auVar175._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar23._4_8_ = auVar175._8_8_;
  auVar23._2_2_ = uVar82;
  auVar23._0_2_ = uVar82;
  fVar205 = (float)((int)sVar53 >> 8);
  fVar206 = (float)(auVar23._0_4_ >> 0x18);
  fVar208 = (float)(auVar175._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar36 * 5) << 2);
  uVar9 = *(undefined4 *)(prim + uVar41 + 6);
  uVar81 = (undefined1)((uint)uVar9 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar9 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar9));
  uVar81 = (undefined1)((uint)uVar9 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar81),uVar81);
  sVar53 = CONCAT11((char)uVar9,(char)uVar9);
  uVar46 = CONCAT62(uVar15,sVar53);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar46;
  auVar180._12_2_ = uVar82;
  auVar180._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar46;
  auVar179._10_2_ = uVar82;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar82;
  auVar178._0_8_ = uVar46;
  uVar82 = (undefined2)uVar15;
  auVar24._4_8_ = auVar178._8_8_;
  auVar24._2_2_ = uVar82;
  auVar24._0_2_ = uVar82;
  fVar235 = (float)((int)sVar53 >> 8);
  fVar242 = (float)(auVar24._0_4_ >> 0x18);
  fVar243 = (float)(auVar178._8_4_ >> 0x18);
  fVar224 = fVar102 * fVar85 + fVar110 * fVar129 + fVar112 * fVar143;
  fVar229 = fVar102 * fVar97 + fVar110 * fVar141 + fVar112 * fVar150;
  fVar231 = fVar102 * fVar99 + fVar110 * fVar142 + fVar112 * fVar151;
  fVar233 = fVar102 * (float)(auVar192._12_4_ >> 0x18) +
            fVar110 * (float)(auVar57._12_4_ >> 0x18) + fVar112 * (float)(auVar60._12_4_ >> 0x18);
  fVar211 = fVar102 * fVar54 + fVar110 * fVar152 + fVar112 * fVar200;
  fVar216 = fVar102 * fVar83 + fVar110 * fVar162 + fVar112 * fVar203;
  fVar219 = fVar102 * fVar84 + fVar110 * fVar164 + fVar112 * fVar204;
  fVar222 = fVar102 * (float)(auVar63._12_4_ >> 0x18) +
            fVar110 * (float)(auVar154._12_4_ >> 0x18) + fVar112 * (float)(auVar170._12_4_ >> 0x18);
  fVar167 = fVar102 * fVar188 + fVar110 * fVar205 + fVar112 * fVar235;
  fVar183 = fVar102 * fVar195 + fVar110 * fVar206 + fVar112 * fVar242;
  fVar185 = fVar102 * fVar197 + fVar110 * fVar208 + fVar112 * fVar243;
  fVar102 = fVar102 * (float)(auVar173._12_4_ >> 0x18) +
            fVar110 * (float)(auVar176._12_4_ >> 0x18) + fVar112 * (float)(auVar179._12_4_ >> 0x18);
  fVar129 = fVar85 * fVar115 + fVar129 * fVar124 + fVar143 * fVar126;
  fVar141 = fVar97 * fVar115 + fVar141 * fVar124 + fVar150 * fVar126;
  fVar142 = fVar99 * fVar115 + fVar142 * fVar124 + fVar151 * fVar126;
  fVar143 = (float)(auVar192._12_4_ >> 0x18) * fVar115 +
            (float)(auVar57._12_4_ >> 0x18) * fVar124 + (float)(auVar60._12_4_ >> 0x18) * fVar126;
  fVar200 = fVar54 * fVar115 + fVar152 * fVar124 + fVar200 * fVar126;
  fVar203 = fVar83 * fVar115 + fVar162 * fVar124 + fVar203 * fVar126;
  fVar164 = fVar84 * fVar115 + fVar164 * fVar124 + fVar204 * fVar126;
  fVar204 = (float)(auVar63._12_4_ >> 0x18) * fVar115 +
            (float)(auVar154._12_4_ >> 0x18) * fVar124 + (float)(auVar170._12_4_ >> 0x18) * fVar126;
  fVar150 = fVar115 * fVar188 + fVar124 * fVar205 + fVar126 * fVar235;
  fVar151 = fVar115 * fVar195 + fVar124 * fVar206 + fVar126 * fVar242;
  fVar152 = fVar115 * fVar197 + fVar124 * fVar208 + fVar126 * fVar243;
  fVar162 = fVar115 * (float)(auVar173._12_4_ >> 0x18) +
            fVar124 * (float)(auVar176._12_4_ >> 0x18) + fVar126 * (float)(auVar179._12_4_ >> 0x18);
  fVar112 = (float)DAT_01ff1d40;
  fVar54 = DAT_01ff1d40._4_4_;
  fVar83 = DAT_01ff1d40._8_4_;
  fVar84 = DAT_01ff1d40._12_4_;
  uVar49 = -(uint)(fVar112 <= ABS(fVar224));
  uVar50 = -(uint)(fVar54 <= ABS(fVar229));
  uVar51 = -(uint)(fVar83 <= ABS(fVar231));
  uVar52 = -(uint)(fVar84 <= ABS(fVar233));
  auVar226._0_4_ = (uint)fVar224 & uVar49;
  auVar226._4_4_ = (uint)fVar229 & uVar50;
  auVar226._8_4_ = (uint)fVar231 & uVar51;
  auVar226._12_4_ = (uint)fVar233 & uVar52;
  auVar117._0_4_ = ~uVar49 & (uint)fVar112;
  auVar117._4_4_ = ~uVar50 & (uint)fVar54;
  auVar117._8_4_ = ~uVar51 & (uint)fVar83;
  auVar117._12_4_ = ~uVar52 & (uint)fVar84;
  auVar117 = auVar117 | auVar226;
  uVar49 = -(uint)(fVar112 <= ABS(fVar211));
  uVar50 = -(uint)(fVar54 <= ABS(fVar216));
  uVar51 = -(uint)(fVar83 <= ABS(fVar219));
  uVar52 = -(uint)(fVar84 <= ABS(fVar222));
  auVar214._0_4_ = (uint)fVar211 & uVar49;
  auVar214._4_4_ = (uint)fVar216 & uVar50;
  auVar214._8_4_ = (uint)fVar219 & uVar51;
  auVar214._12_4_ = (uint)fVar222 & uVar52;
  auVar130._0_4_ = ~uVar49 & (uint)fVar112;
  auVar130._4_4_ = ~uVar50 & (uint)fVar54;
  auVar130._8_4_ = ~uVar51 & (uint)fVar83;
  auVar130._12_4_ = ~uVar52 & (uint)fVar84;
  auVar130 = auVar130 | auVar214;
  uVar49 = -(uint)(fVar112 <= ABS(fVar167));
  uVar50 = -(uint)(fVar54 <= ABS(fVar183));
  uVar51 = -(uint)(fVar83 <= ABS(fVar185));
  uVar52 = -(uint)(fVar84 <= ABS(fVar102));
  auVar181._0_4_ = (uint)fVar167 & uVar49;
  auVar181._4_4_ = (uint)fVar183 & uVar50;
  auVar181._8_4_ = (uint)fVar185 & uVar51;
  auVar181._12_4_ = (uint)fVar102 & uVar52;
  auVar190._0_4_ = ~uVar49 & (uint)fVar112;
  auVar190._4_4_ = ~uVar50 & (uint)fVar54;
  auVar190._8_4_ = ~uVar51 & (uint)fVar83;
  auVar190._12_4_ = ~uVar52 & (uint)fVar84;
  auVar190 = auVar190 | auVar181;
  auVar65 = rcpps(_DAT_01ff1d40,auVar117);
  fVar112 = auVar65._0_4_;
  fVar84 = auVar65._4_4_;
  fVar99 = auVar65._8_4_;
  fVar115 = auVar65._12_4_;
  fVar112 = (1.0 - auVar117._0_4_ * fVar112) * fVar112 + fVar112;
  fVar84 = (1.0 - auVar117._4_4_ * fVar84) * fVar84 + fVar84;
  fVar99 = (1.0 - auVar117._8_4_ * fVar99) * fVar99 + fVar99;
  fVar115 = (1.0 - auVar117._12_4_ * fVar115) * fVar115 + fVar115;
  auVar65 = rcpps(auVar65,auVar130);
  fVar54 = auVar65._0_4_;
  fVar85 = auVar65._4_4_;
  fVar102 = auVar65._8_4_;
  fVar124 = auVar65._12_4_;
  fVar54 = (1.0 - auVar130._0_4_ * fVar54) * fVar54 + fVar54;
  fVar85 = (1.0 - auVar130._4_4_ * fVar85) * fVar85 + fVar85;
  fVar102 = (1.0 - auVar130._8_4_ * fVar102) * fVar102 + fVar102;
  fVar124 = (1.0 - auVar130._12_4_ * fVar124) * fVar124 + fVar124;
  auVar65 = rcpps(auVar65,auVar190);
  fVar83 = auVar65._0_4_;
  fVar97 = auVar65._4_4_;
  fVar110 = auVar65._8_4_;
  fVar126 = auVar65._12_4_;
  fVar83 = (1.0 - auVar190._0_4_ * fVar83) * fVar83 + fVar83;
  fVar97 = (1.0 - auVar190._4_4_ * fVar97) * fVar97 + fVar97;
  fVar110 = (1.0 - auVar190._8_4_ * fVar110) * fVar110 + fVar110;
  fVar126 = (1.0 - auVar190._12_4_ * fVar126) * fVar126 + fVar126;
  uVar46 = *(ulong *)(prim + uVar36 * 7 + 6);
  uVar82 = (undefined2)(uVar46 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar46;
  auVar68._12_2_ = uVar82;
  auVar68._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar46 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar46;
  auVar67._10_2_ = uVar82;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar82;
  auVar66._0_8_ = uVar46;
  uVar82 = (undefined2)(uVar46 >> 0x10);
  auVar25._4_8_ = auVar66._8_8_;
  auVar25._2_2_ = uVar82;
  auVar25._0_2_ = uVar82;
  auVar118._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar141) * fVar84,
                ((float)(int)(short)uVar46 - fVar129) * fVar112);
  auVar118._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar142) * fVar99;
  auVar118._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar143) * fVar115;
  uVar46 = *(ulong *)(prim + uVar36 * 9 + 6);
  uVar82 = (undefined2)(uVar46 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar46;
  auVar71._12_2_ = uVar82;
  auVar71._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar46 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar46;
  auVar70._10_2_ = uVar82;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar82;
  auVar69._0_8_ = uVar46;
  uVar82 = (undefined2)(uVar46 >> 0x10);
  auVar26._4_8_ = auVar69._8_8_;
  auVar26._2_2_ = uVar82;
  auVar26._0_2_ = uVar82;
  auVar131._0_4_ = ((float)(int)(short)uVar46 - fVar129) * fVar112;
  auVar131._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar141) * fVar84;
  auVar131._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar142) * fVar99;
  auVar131._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar143) * fVar115;
  uVar46 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar36 * -2 + 6);
  uVar82 = (undefined2)(uVar45 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar45;
  auVar89._12_2_ = uVar82;
  auVar89._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar45 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar45;
  auVar88._10_2_ = uVar82;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar82;
  auVar87._0_8_ = uVar45;
  uVar82 = (undefined2)(uVar45 >> 0x10);
  auVar27._4_8_ = auVar87._8_8_;
  auVar27._2_2_ = uVar82;
  auVar27._0_2_ = uVar82;
  auVar90._0_8_ =
       CONCAT44(((float)(auVar27._0_4_ >> 0x10) - fVar203) * fVar85,
                ((float)(int)(short)uVar45 - fVar200) * fVar54);
  auVar90._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar164) * fVar102;
  auVar90._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar204) * fVar124;
  uVar82 = (undefined2)(uVar46 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar46;
  auVar74._12_2_ = uVar82;
  auVar74._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar46 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar46;
  auVar73._10_2_ = uVar82;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar82;
  auVar72._0_8_ = uVar46;
  uVar82 = (undefined2)(uVar46 >> 0x10);
  auVar28._4_8_ = auVar72._8_8_;
  auVar28._2_2_ = uVar82;
  auVar28._0_2_ = uVar82;
  auVar182._0_4_ = ((float)(int)(short)uVar46 - fVar200) * fVar54;
  auVar182._4_4_ = ((float)(auVar28._0_4_ >> 0x10) - fVar203) * fVar85;
  auVar182._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar164) * fVar102;
  auVar182._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar204) * fVar124;
  uVar46 = *(ulong *)(prim + uVar41 + uVar36 + 6);
  uVar82 = (undefined2)(uVar46 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar46;
  auVar77._12_2_ = uVar82;
  auVar77._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar46 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar46;
  auVar76._10_2_ = uVar82;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar82;
  auVar75._0_8_ = uVar46;
  uVar82 = (undefined2)(uVar46 >> 0x10);
  auVar29._4_8_ = auVar75._8_8_;
  auVar29._2_2_ = uVar82;
  auVar29._0_2_ = uVar82;
  auVar78._0_8_ =
       CONCAT44(((float)(auVar29._0_4_ >> 0x10) - fVar151) * fVar97,
                ((float)(int)(short)uVar46 - fVar150) * fVar83);
  auVar78._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar152) * fVar110;
  auVar78._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar162) * fVar126;
  uVar46 = *(ulong *)(prim + uVar36 * 0x17 + 6);
  uVar82 = (undefined2)(uVar46 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar46;
  auVar158._12_2_ = uVar82;
  auVar158._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar46 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar46;
  auVar157._10_2_ = uVar82;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar82;
  auVar156._0_8_ = uVar46;
  uVar82 = (undefined2)(uVar46 >> 0x10);
  auVar30._4_8_ = auVar156._8_8_;
  auVar30._2_2_ = uVar82;
  auVar30._0_2_ = uVar82;
  auVar159._0_4_ = ((float)(int)(short)uVar46 - fVar150) * fVar83;
  auVar159._4_4_ = ((float)(auVar30._0_4_ >> 0x10) - fVar151) * fVar97;
  auVar159._8_4_ = ((float)(auVar156._8_4_ >> 0x10) - fVar152) * fVar110;
  auVar159._12_4_ = ((float)(auVar157._12_4_ >> 0x10) - fVar162) * fVar126;
  auVar191._8_4_ = auVar118._8_4_;
  auVar191._0_8_ = auVar118._0_8_;
  auVar191._12_4_ = auVar118._12_4_;
  auVar192 = minps(auVar191,auVar131);
  auVar104._8_4_ = auVar90._8_4_;
  auVar104._0_8_ = auVar90._0_8_;
  auVar104._12_4_ = auVar90._12_4_;
  auVar65 = minps(auVar104,auVar182);
  auVar192 = maxps(auVar192,auVar65);
  auVar105._8_4_ = auVar78._8_4_;
  auVar105._0_8_ = auVar78._0_8_;
  auVar105._12_4_ = auVar78._12_4_;
  auVar65 = minps(auVar105,auVar159);
  uVar9 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  local_3e8._4_4_ = uVar9;
  local_3e8._0_4_ = uVar9;
  local_3e8._8_4_ = uVar9;
  local_3e8._12_4_ = uVar9;
  auVar65 = maxps(auVar65,local_3e8);
  auVar65 = maxps(auVar192,auVar65);
  local_48 = auVar65._0_4_ * 0.99999964;
  fStack_44 = auVar65._4_4_ * 0.99999964;
  fStack_40 = auVar65._8_4_ * 0.99999964;
  fStack_3c = auVar65._12_4_ * 0.99999964;
  auVar192 = maxps(auVar118,auVar131);
  auVar65 = maxps(auVar90,auVar182);
  auVar192 = minps(auVar192,auVar65);
  auVar65 = maxps(auVar78,auVar159);
  fVar112 = ray->tfar;
  auVar91._4_4_ = fVar112;
  auVar91._0_4_ = fVar112;
  auVar91._8_4_ = fVar112;
  auVar91._12_4_ = fVar112;
  auVar65 = minps(auVar65,auVar91);
  auVar65 = minps(auVar192,auVar65);
  auVar92._0_4_ = -(uint)(PVar8 != (Primitive)0x0 && local_48 <= auVar65._0_4_ * 1.0000004);
  auVar92._4_4_ = -(uint)(1 < (byte)PVar8 && fStack_44 <= auVar65._4_4_ * 1.0000004);
  auVar92._8_4_ = -(uint)(2 < (byte)PVar8 && fStack_40 <= auVar65._8_4_ * 1.0000004);
  auVar92._12_4_ = -(uint)(3 < (byte)PVar8 && fStack_3c <= auVar65._12_4_ * 1.0000004);
  uVar49 = movmskps((uint)(byte)PVar8,auVar92);
  bVar47 = uVar49 != 0;
  if (bVar47) {
    uVar49 = uVar49 & 0xff;
    local_318 = mm_lookupmask_ps._0_8_;
    uStack_310 = mm_lookupmask_ps._8_8_;
    do {
      uVar46 = (ulong)uVar49;
      lVar12 = 0;
      if (uVar46 != 0) {
        for (; (uVar49 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      uVar46 = uVar46 - 1 & uVar46;
      local_320 = (ulong)*(uint *)(prim + 2);
      local_240 = (ulong)*(uint *)(prim + lVar12 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[local_320].ptr;
      uVar45 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_240);
      p_Var39 = pGVar11[1].intersectionFilterN;
      auVar37 = *(undefined1 (*) [8])&pGVar11[1].time_range.upper;
      ppp_Var1 = (_func_int ***)
                 ((long)&(((Geometry *)auVar37)->super_RefCount)._vptr_RefCount +
                 (long)p_Var39 * uVar45);
      fVar112 = *(float *)ppp_Var1;
      fVar54 = *(float *)((long)ppp_Var1 + 4);
      fVar83 = *(float *)&(((atomic<unsigned_long> *)(ppp_Var1 + 1))->
                          super___atomic_base<unsigned_long>)._M_i;
      fStack_3cc = *(float *)((long)ppp_Var1 + 0xc);
      ppp_Var1 = (_func_int ***)
                 ((long)&(((Geometry *)auVar37)->super_RefCount)._vptr_RefCount +
                 (uVar45 + 1) * (long)p_Var39);
      local_2e8 = *(float *)ppp_Var1;
      fStack_2e4 = *(float *)((long)ppp_Var1 + 4);
      aStack_2e0 = *(anon_struct_4_6_abad0318_for_Geometry_10 *)
                    &(((atomic<unsigned_long> *)(ppp_Var1 + 1))->super___atomic_base<unsigned_long>)
                     ._M_i;
      fStack_2dc = *(float *)((long)ppp_Var1 + 0xc);
      ppp_Var2 = (_func_int ***)
                 ((long)&(((Geometry *)auVar37)->super_RefCount)._vptr_RefCount +
                 (uVar45 + 2) * (long)p_Var39);
      local_2f8 = *(float *)ppp_Var2;
      fStack_2f4 = *(float *)((long)ppp_Var2 + 4);
      fStack_2f0 = *(float *)&(((atomic<unsigned_long> *)(ppp_Var2 + 1))->
                              super___atomic_base<unsigned_long>)._M_i;
      fStack_2ec = *(float *)((long)ppp_Var2 + 0xc);
      lVar12 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      ppp_Var3 = (_func_int ***)
                 ((long)&(((Geometry *)auVar37)->super_RefCount)._vptr_RefCount +
                 (uVar45 + 3) * (long)p_Var39);
      local_308 = *(float *)ppp_Var3;
      fStack_304 = *(float *)((long)ppp_Var3 + 4);
      fStack_300 = *(float *)&(((atomic<unsigned_long> *)(ppp_Var3 + 1))->
                              super___atomic_base<unsigned_long>)._M_i;
      fStack_2fc = *(float *)((long)ppp_Var3 + 0xc);
      if (((uVar46 != 0) && (uVar45 = uVar46 - 1 & uVar46, uVar45 != 0)) &&
         (lVar12 = 0, uVar45 != 0)) {
        for (; (uVar45 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar84 = (ray->org).field_0.m128[0];
      fVar85 = (ray->org).field_0.m128[1];
      fVar97 = (ray->org).field_0.m128[2];
      fVar143 = fVar112 - fVar84;
      fVar150 = fVar54 - fVar85;
      fVar151 = fVar83 - fVar97;
      fVar99 = (pre->ray_space).vx.field_0.m128[0];
      fVar102 = (pre->ray_space).vx.field_0.m128[1];
      fVar110 = (pre->ray_space).vx.field_0.m128[2];
      fVar115 = (pre->ray_space).vy.field_0.m128[0];
      fVar124 = (pre->ray_space).vy.field_0.m128[1];
      fVar126 = (pre->ray_space).vy.field_0.m128[2];
      fVar129 = (pre->ray_space).vz.field_0.m128[0];
      fVar141 = (pre->ray_space).vz.field_0.m128[1];
      fVar142 = (pre->ray_space).vz.field_0.m128[2];
      local_198 = fVar143 * fVar99 + fVar150 * fVar115 + fVar151 * fVar129;
      local_218 = fVar143 * fVar102 + fVar150 * fVar124 + fVar151 * fVar141;
      local_3a8 = fVar143 * fVar110 + fVar150 * fVar126 + fVar151 * fVar142;
      fVar143 = local_2e8 - fVar84;
      fVar150 = fStack_2e4 - fVar85;
      fVar151 = (float)aStack_2e0 - fVar97;
      local_1a8 = fVar143 * fVar99 + fVar150 * fVar115 + fVar151 * fVar129;
      local_1b8 = fVar143 * fVar102 + fVar150 * fVar124 + fVar151 * fVar141;
      local_338 = fVar143 * fVar110 + fVar150 * fVar126 + fVar151 * fVar142;
      fVar150 = local_2f8 - fVar84;
      fVar151 = fStack_2f4 - fVar85;
      fVar152 = fStack_2f0 - fVar97;
      local_3b8 = fVar150 * fVar99 + fVar151 * fVar115 + fVar152 * fVar129;
      fVar143 = fVar150 * fVar102 + fVar151 * fVar124 + fVar152 * fVar141;
      local_1f8 = fVar150 * fVar110 + fVar151 * fVar126 + fVar152 * fVar142;
      fVar84 = local_308 - fVar84;
      fVar85 = fStack_304 - fVar85;
      fVar97 = fStack_300 - fVar97;
      local_208 = fVar84 * fVar99 + fVar85 * fVar115 + fVar97 * fVar129;
      fVar99 = fVar84 * fVar102 + fVar85 * fVar124 + fVar97 * fVar141;
      local_368 = fVar84 * fVar110 + fVar85 * fVar126 + fVar97 * fVar142;
      auVar236._0_8_ = CONCAT44(local_218,local_198) & 0x7fffffff7fffffff;
      auVar236._8_4_ = ABS(local_3a8);
      auVar236._12_4_ = ABS(fStack_3cc);
      auVar132._0_8_ = CONCAT44(local_1b8,local_1a8) & 0x7fffffff7fffffff;
      auVar132._8_4_ = ABS(local_338);
      auVar132._12_4_ = ABS(fStack_2dc);
      auVar192 = maxps(auVar236,auVar132);
      auVar144._0_8_ = CONCAT44(fVar143,local_3b8) & 0x7fffffff7fffffff;
      auVar144._8_4_ = ABS(local_1f8);
      auVar144._12_4_ = ABS(fStack_2ec);
      auVar93._0_8_ = CONCAT44(fVar99,local_208) & 0x7fffffff7fffffff;
      auVar93._8_4_ = ABS(local_368);
      auVar93._12_4_ = ABS(fStack_2fc);
      auVar65 = maxps(auVar144,auVar93);
      auVar65 = maxps(auVar192,auVar65);
      fVar84 = auVar65._4_4_;
      if (auVar65._4_4_ <= auVar65._0_4_) {
        fVar84 = auVar65._0_4_;
      }
      auVar237._8_8_ = auVar65._8_8_;
      auVar237._0_8_ = auVar65._8_8_;
      fVar85 = (float)iVar10;
      _local_238 = ZEXT416((uint)fVar85);
      if (auVar65._8_4_ <= fVar84) {
        auVar237._0_4_ = fVar84;
      }
      lVar12 = (long)iVar10 * 0x44;
      fVar84 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar12 + 0x908);
      fVar97 = *(float *)(catmullrom_basis0 + lVar12 + 0x90c);
      fVar102 = *(float *)(catmullrom_basis0 + lVar12 + 0x910);
      auVar16 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar12 + 0x908);
      fVar110 = *(float *)(catmullrom_basis0 + lVar12 + 0x914);
      fVar115 = *(float *)(catmullrom_basis0 + lVar12 + 0xd8c);
      fVar124 = *(float *)(catmullrom_basis0 + lVar12 + 0xd90);
      fVar126 = *(float *)(catmullrom_basis0 + lVar12 + 0xd94);
      fVar129 = *(float *)(catmullrom_basis0 + lVar12 + 0xd98);
      fVar141 = *(float *)(catmullrom_basis0 + lVar12 + 0x484);
      fVar142 = *(float *)(catmullrom_basis0 + lVar12 + 0x488);
      fVar150 = *(float *)(catmullrom_basis0 + lVar12 + 0x48c);
      fVar151 = *(float *)(catmullrom_basis0 + lVar12 + 0x490);
      pauVar4 = (undefined1 (*) [16])(catmullrom_basis0 + lVar12);
      fVar152 = *(float *)*pauVar4;
      fVar162 = *(float *)(catmullrom_basis0 + lVar12 + 4);
      fVar164 = *(float *)(catmullrom_basis0 + lVar12 + 8);
      auVar17 = *(undefined1 (*) [12])*pauVar4;
      fVar167 = *(float *)(catmullrom_basis0 + lVar12 + 0xc);
      fVar225 = local_198 * fVar152 + local_1a8 * fVar141 + local_3b8 * fVar84 + local_208 * fVar115
      ;
      fVar230 = local_198 * fVar162 + local_1a8 * fVar142 + local_3b8 * fVar97 + local_208 * fVar124
      ;
      fVar232 = local_198 * fVar164 +
                local_1a8 * fVar150 + local_3b8 * fVar102 + local_208 * fVar126;
      fVar234 = local_198 * fVar167 +
                local_1a8 * fVar151 + local_3b8 * fVar110 + local_208 * fVar129;
      fVar231 = local_218 * fVar152 + local_1b8 * fVar141 + fVar143 * fVar84 + fVar99 * fVar115;
      fVar233 = local_218 * fVar162 + local_1b8 * fVar142 + fVar143 * fVar97 + fVar99 * fVar124;
      fVar235 = local_218 * fVar164 + local_1b8 * fVar150 + fVar143 * fVar102 + fVar99 * fVar126;
      fVar242 = local_218 * fVar167 + local_1b8 * fVar151 + fVar143 * fVar110 + fVar99 * fVar129;
      auVar106._0_4_ =
           fStack_3cc * fVar152 + fStack_2dc * fVar141 + fStack_2ec * fVar84 + fStack_2fc * fVar115;
      auVar106._4_4_ =
           fStack_3cc * fVar162 + fStack_2dc * fVar142 + fStack_2ec * fVar97 + fStack_2fc * fVar124;
      auVar106._8_4_ =
           fStack_3cc * fVar164 + fStack_2dc * fVar150 + fStack_2ec * fVar102 + fStack_2fc * fVar126
      ;
      auVar106._12_4_ =
           fStack_3cc * fVar167 + fStack_2dc * fVar151 + fStack_2ec * fVar110 + fStack_2fc * fVar129
      ;
      fVar97 = *(float *)(catmullrom_basis1 + lVar12 + 0xd8c);
      fVar102 = *(float *)(catmullrom_basis1 + lVar12 + 0xd90);
      fVar152 = *(float *)(catmullrom_basis1 + lVar12 + 0xd94);
      fVar162 = *(float *)(catmullrom_basis1 + lVar12 + 0xd98);
      fVar164 = *(float *)(catmullrom_basis1 + lVar12 + 0x908);
      fVar183 = *(float *)(catmullrom_basis1 + lVar12 + 0x90c);
      fVar185 = *(float *)(catmullrom_basis1 + lVar12 + 0x910);
      fVar188 = *(float *)(catmullrom_basis1 + lVar12 + 0x914);
      local_88 = fStack_2fc;
      fStack_84 = fStack_2fc;
      fStack_80 = fStack_2fc;
      fStack_7c = fStack_2fc;
      local_78 = fStack_2ec;
      fStack_74 = fStack_2ec;
      fStack_70 = fStack_2ec;
      fStack_6c = fStack_2ec;
      fVar195 = *(float *)(catmullrom_basis1 + lVar12 + 0x484);
      fVar197 = *(float *)(catmullrom_basis1 + lVar12 + 0x488);
      fVar200 = *(float *)(catmullrom_basis1 + lVar12 + 0x48c);
      fVar203 = *(float *)(catmullrom_basis1 + lVar12 + 0x490);
      local_98 = fStack_2dc;
      fStack_94 = fStack_2dc;
      fStack_90 = fStack_2dc;
      fStack_8c = fStack_2dc;
      fVar204 = *(float *)(catmullrom_basis1 + lVar12);
      fVar205 = *(float *)(catmullrom_basis1 + lVar12 + 4);
      fVar206 = *(float *)(catmullrom_basis1 + lVar12 + 8);
      fVar208 = *(float *)(catmullrom_basis1 + lVar12 + 0xc);
      local_348._0_4_ =
           local_198 * fVar204 + local_1a8 * fVar195 + local_3b8 * fVar164 + local_208 * fVar97;
      local_348._4_4_ =
           local_198 * fVar205 + local_1a8 * fVar197 + local_3b8 * fVar183 + local_208 * fVar102;
      fStack_340 = local_198 * fVar206 +
                   local_1a8 * fVar200 + local_3b8 * fVar185 + local_208 * fVar152;
      fStack_33c = local_198 * fVar208 +
                   local_1a8 * fVar203 + local_3b8 * fVar188 + local_208 * fVar162;
      fVar189 = local_218 * fVar204 + local_1b8 * fVar195 + fVar143 * fVar164 + fVar99 * fVar97;
      fVar196 = local_218 * fVar205 + local_1b8 * fVar197 + fVar143 * fVar183 + fVar99 * fVar102;
      fVar198 = local_218 * fVar206 + local_1b8 * fVar200 + fVar143 * fVar185 + fVar99 * fVar152;
      fVar199 = local_218 * fVar208 + local_1b8 * fVar203 + fVar143 * fVar188 + fVar99 * fVar162;
      local_a8 = fStack_3cc;
      fStack_a4 = fStack_3cc;
      fStack_a0 = fStack_3cc;
      fStack_9c = fStack_3cc;
      local_428._0_4_ =
           fStack_3cc * fVar204 + fStack_2dc * fVar195 + fStack_2ec * fVar164 + fStack_2fc * fVar97;
      local_428._4_4_ =
           fStack_3cc * fVar205 + fStack_2dc * fVar197 + fStack_2ec * fVar183 + fStack_2fc * fVar102
      ;
      fStack_420 = fStack_3cc * fVar206 +
                   fStack_2dc * fVar200 + fStack_2ec * fVar185 + fStack_2fc * fVar152;
      fStack_41c = fStack_3cc * fVar208 +
                   fStack_2dc * fVar203 + fStack_2ec * fVar188 + fStack_2fc * fVar162;
      fVar243 = (float)local_348._0_4_ - fVar225;
      fVar163 = (float)local_348._4_4_ - fVar230;
      fVar165 = fStack_340 - fVar232;
      fVar166 = fStack_33c - fVar234;
      local_298 = fVar189 - fVar231;
      fStack_294 = fVar196 - fVar233;
      fStack_290 = fVar198 - fVar235;
      fStack_28c = fVar199 - fVar242;
      _local_288 = CONCAT44(fVar233,fVar231);
      uStack_280 = CONCAT44(fVar242,fVar235);
      fVar84 = fVar231 * fVar243 - fVar225 * local_298;
      fVar211 = fVar233 * fVar163 - fVar230 * fStack_294;
      fVar216 = fVar235 * fVar165 - fVar232 * fStack_290;
      fVar219 = fVar242 * fVar166 - fVar234 * fStack_28c;
      auVar65 = maxps(auVar106,_local_428);
      bVar32 = fVar84 * fVar84 <=
               auVar65._0_4_ * auVar65._0_4_ * (fVar243 * fVar243 + local_298 * local_298) &&
               0.0 < fVar85;
      auVar119._0_4_ = -(uint)bVar32;
      bVar33 = fVar211 * fVar211 <=
               auVar65._4_4_ * auVar65._4_4_ * (fVar163 * fVar163 + fStack_294 * fStack_294) &&
               1.0 < fVar85;
      auVar119._4_4_ = -(uint)bVar33;
      bVar31 = fVar216 * fVar216 <=
               auVar65._8_4_ * auVar65._8_4_ * (fVar165 * fVar165 + fStack_290 * fStack_290) &&
               2.0 < fVar85;
      auVar119._8_4_ = -(uint)bVar31;
      bVar48 = fVar219 * fVar219 <=
               auVar65._12_4_ * auVar65._12_4_ * (fVar166 * fVar166 + fStack_28c * fStack_28c) &&
               3.0 < fVar85;
      auVar119._12_4_ = -(uint)bVar48;
      local_2d8 = auVar237._0_4_;
      fStack_2d4 = auVar237._4_4_;
      fStack_2d0 = auVar237._8_4_;
      fStack_2cc = auVar237._12_4_;
      local_2d8 = local_2d8 * 4.7683716e-07;
      iVar35 = movmskps(iVar10,auVar119);
      fVar84 = (ray->org).field_0.m128[3];
      _local_228 = ZEXT416((uint)fVar84);
      local_3c0 = context;
      local_350 = pre;
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fVar211 = fVar99;
      fVar216 = fVar99;
      fVar219 = fVar99;
      fVar222 = fVar143;
      fVar224 = fVar143;
      fVar229 = fVar143;
      local_408 = fVar99;
      fStack_404 = fVar99;
      fStack_400 = fVar99;
      fStack_3fc = fVar99;
      local_3d8 = fVar112;
      fStack_3d4 = fVar54;
      fStack_3d0 = fVar83;
      fStack_3b4 = local_3b8;
      fStack_3b0 = local_3b8;
      fStack_3ac = local_3b8;
      fStack_3a4 = local_3a8;
      fStack_3a0 = local_3a8;
      fStack_39c = local_3a8;
      local_378 = fVar143;
      fStack_374 = fVar143;
      fStack_370 = fVar143;
      fStack_36c = fVar143;
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_214 = local_218;
      fStack_210 = local_218;
      fStack_20c = local_218;
      fStack_204 = local_208;
      fStack_200 = local_208;
      fStack_1fc = local_208;
      fStack_1f4 = local_1f8;
      fStack_1f0 = local_1f8;
      fStack_1ec = local_1f8;
      fStack_1b4 = local_1b8;
      fStack_1b0 = local_1b8;
      fStack_1ac = local_1b8;
      fStack_1a4 = local_1a8;
      fStack_1a0 = local_1a8;
      fStack_19c = local_1a8;
      fStack_194 = local_198;
      fStack_190 = local_198;
      fStack_18c = local_198;
      if (iVar35 == 0) {
LAB_00b65021:
        iVar35 = 0;
        bVar48 = false;
      }
      else {
        fVar103 = fVar97 * local_368 + fVar164 * local_1f8 + fVar195 * local_338 +
                  fVar204 * local_3a8;
        fVar111 = fVar102 * local_368 + fVar183 * local_1f8 + fVar197 * local_338 +
                  fVar205 * local_3a8;
        fVar113 = fVar152 * local_368 + fVar185 * local_1f8 + fVar200 * local_338 +
                  fVar206 * local_3a8;
        fVar114 = fVar162 * local_368 + fVar188 * local_1f8 + fVar203 * local_338 +
                  fVar208 * local_3a8;
        local_1c8._0_4_ = auVar17._0_4_;
        local_1c8._4_4_ = auVar17._4_4_;
        fStack_1c0 = auVar17._8_4_;
        local_398._0_4_ = auVar16._0_4_;
        local_398._4_4_ = auVar16._4_4_;
        uStack_390._0_4_ = auVar16._8_4_;
        fVar116 = fVar115 * local_368 + (float)local_398._0_4_ * local_1f8 + fVar141 * local_338 +
                  (float)local_1c8._0_4_ * local_3a8;
        fVar125 = fVar124 * local_368 + (float)local_398._4_4_ * local_1f8 + fVar142 * local_338 +
                  (float)local_1c8._4_4_ * local_3a8;
        fVar127 = fVar126 * local_368 + (float)uStack_390 * local_1f8 + fVar150 * local_338 +
                  fStack_1c0 * local_3a8;
        fVar128 = fVar129 * local_368 + fVar110 * local_1f8 + fVar151 * local_338 +
                  fVar167 * local_3a8;
        fVar97 = *(float *)(catmullrom_basis0 + lVar12 + 0x1210);
        fVar102 = *(float *)(catmullrom_basis0 + lVar12 + 0x1214);
        fVar110 = *(float *)(catmullrom_basis0 + lVar12 + 0x1218);
        fVar115 = *(float *)(catmullrom_basis0 + lVar12 + 0x121c);
        fVar124 = *(float *)(catmullrom_basis0 + lVar12 + 0x1694);
        fVar126 = *(float *)(catmullrom_basis0 + lVar12 + 0x1698);
        fVar129 = *(float *)(catmullrom_basis0 + lVar12 + 0x169c);
        fVar141 = *(float *)(catmullrom_basis0 + lVar12 + 0x16a0);
        fVar142 = *(float *)(catmullrom_basis0 + lVar12 + 0x1b18);
        fVar150 = *(float *)(catmullrom_basis0 + lVar12 + 0x1b1c);
        fVar151 = *(float *)(catmullrom_basis0 + lVar12 + 0x1b20);
        fVar152 = *(float *)(catmullrom_basis0 + lVar12 + 0x1b24);
        fVar162 = *(float *)(catmullrom_basis0 + lVar12 + 0x1f9c);
        fVar164 = *(float *)(catmullrom_basis0 + lVar12 + 0x1fa0);
        fVar167 = *(float *)(catmullrom_basis0 + lVar12 + 0x1fa4);
        fVar183 = *(float *)(catmullrom_basis0 + lVar12 + 0x1fa8);
        fVar212 = local_198 * fVar97 +
                  local_1a8 * fVar124 + local_3b8 * fVar142 + local_208 * fVar162;
        fVar217 = local_198 * fVar102 +
                  local_1a8 * fVar126 + local_3b8 * fVar150 + local_208 * fVar164;
        fVar220 = local_198 * fVar110 +
                  local_1a8 * fVar129 + local_3b8 * fVar151 + local_208 * fVar167;
        fVar223 = local_198 * fVar115 +
                  local_1a8 * fVar141 + local_3b8 * fVar152 + local_208 * fVar183;
        fVar246 = local_218 * fVar97 + local_1b8 * fVar124 + fVar143 * fVar142 + fVar99 * fVar162;
        fVar247 = local_218 * fVar102 + local_1b8 * fVar126 + fVar143 * fVar150 + fVar99 * fVar164;
        fVar248 = local_218 * fVar110 + local_1b8 * fVar129 + fVar143 * fVar151 + fVar99 * fVar167;
        fVar249 = local_218 * fVar115 + local_1b8 * fVar141 + fVar143 * fVar152 + fVar99 * fVar183;
        fVar185 = *(float *)(catmullrom_basis1 + lVar12 + 0x1210);
        fVar188 = *(float *)(catmullrom_basis1 + lVar12 + 0x1214);
        fVar195 = *(float *)(catmullrom_basis1 + lVar12 + 0x1218);
        fVar197 = *(float *)(catmullrom_basis1 + lVar12 + 0x121c);
        fVar200 = *(float *)(catmullrom_basis1 + lVar12 + 0x1b18);
        fVar203 = *(float *)(catmullrom_basis1 + lVar12 + 0x1b1c);
        fVar204 = *(float *)(catmullrom_basis1 + lVar12 + 0x1b20);
        fVar205 = *(float *)(catmullrom_basis1 + lVar12 + 0x1b24);
        fVar206 = *(float *)(catmullrom_basis1 + lVar12 + 0x1f9c);
        fVar208 = *(float *)(catmullrom_basis1 + lVar12 + 0x1fa0);
        fVar207 = *(float *)(catmullrom_basis1 + lVar12 + 0x1fa4);
        fVar209 = *(float *)(catmullrom_basis1 + lVar12 + 0x1fa8);
        fVar210 = *(float *)(catmullrom_basis1 + lVar12 + 0x1694);
        fVar213 = *(float *)(catmullrom_basis1 + lVar12 + 0x1698);
        fVar218 = *(float *)(catmullrom_basis1 + lVar12 + 0x169c);
        fVar221 = *(float *)(catmullrom_basis1 + lVar12 + 0x16a0);
        fVar168 = local_198 * fVar185 +
                  local_1a8 * fVar210 + local_3b8 * fVar200 + local_208 * fVar206;
        fVar184 = local_198 * fVar188 +
                  local_1a8 * fVar213 + local_3b8 * fVar203 + local_208 * fVar208;
        fVar186 = local_198 * fVar195 +
                  local_1a8 * fVar218 + local_3b8 * fVar204 + local_208 * fVar207;
        fVar187 = local_198 * fVar197 +
                  local_1a8 * fVar221 + local_3b8 * fVar205 + local_208 * fVar209;
        fVar86 = local_218 * fVar185 + local_1b8 * fVar210 + fVar143 * fVar200 + fVar99 * fVar206;
        fVar98 = local_218 * fVar188 + local_1b8 * fVar213 + fVar143 * fVar203 + fVar99 * fVar208;
        fVar100 = local_218 * fVar195 + local_1b8 * fVar218 + fVar143 * fVar204 + fVar99 * fVar207;
        fVar101 = local_218 * fVar197 + local_1b8 * fVar221 + fVar143 * fVar205 + fVar99 * fVar209;
        auVar227._0_8_ = CONCAT44(fVar217,fVar212) & 0x7fffffff7fffffff;
        auVar227._8_4_ = ABS(fVar220);
        auVar227._12_4_ = ABS(fVar223);
        auVar193._0_8_ = CONCAT44(fVar247,fVar246) & 0x7fffffff7fffffff;
        auVar193._8_4_ = ABS(fVar248);
        auVar193._12_4_ = ABS(fVar249);
        auVar65 = maxps(auVar227,auVar193);
        auVar238._0_8_ =
             CONCAT44(fVar102 * local_3a8 +
                      fVar126 * local_338 + fVar150 * local_1f8 + fVar164 * local_368,
                      fVar97 * local_3a8 +
                      fVar124 * local_338 + fVar142 * local_1f8 + fVar162 * local_368) &
             0x7fffffff7fffffff;
        auVar238._8_4_ =
             ABS(fVar110 * local_3a8 +
                 fVar129 * local_338 + fVar151 * local_1f8 + fVar167 * local_368);
        auVar238._12_4_ =
             ABS(fVar115 * local_3a8 +
                 fVar141 * local_338 + fVar152 * local_1f8 + fVar183 * local_368);
        auVar65 = maxps(auVar65,auVar238);
        uVar49 = -(uint)(local_2d8 <= auVar65._0_4_);
        uVar50 = -(uint)(local_2d8 <= auVar65._4_4_);
        uVar51 = -(uint)(local_2d8 <= auVar65._8_4_);
        uVar52 = -(uint)(local_2d8 <= auVar65._12_4_);
        fVar142 = (float)((uint)fVar212 & uVar49 | ~uVar49 & (uint)fVar243);
        fVar150 = (float)((uint)fVar217 & uVar50 | ~uVar50 & (uint)fVar163);
        fVar151 = (float)((uint)fVar220 & uVar51 | ~uVar51 & (uint)fVar165);
        fVar152 = (float)((uint)fVar223 & uVar52 | ~uVar52 & (uint)fVar166);
        auVar14._4_4_ = fStack_294;
        auVar14._0_4_ = local_298;
        auVar14._8_4_ = fStack_290;
        auVar14._12_4_ = fStack_28c;
        fVar162 = (float)(~uVar49 & (uint)local_298 | (uint)fVar246 & uVar49);
        fVar164 = (float)(~uVar50 & (uint)fStack_294 | (uint)fVar247 & uVar50);
        fVar167 = (float)(~uVar51 & (uint)fStack_290 | (uint)fVar248 & uVar51);
        fVar183 = (float)(~uVar52 & (uint)fStack_28c | (uint)fVar249 & uVar52);
        auVar239._0_8_ = CONCAT44(fVar184,fVar168) & 0x7fffffff7fffffff;
        auVar239._8_4_ = ABS(fVar186);
        auVar239._12_4_ = ABS(fVar187);
        auVar201._0_8_ = CONCAT44(fVar98,fVar86) & 0x7fffffff7fffffff;
        auVar201._8_4_ = ABS(fVar100);
        auVar201._12_4_ = ABS(fVar101);
        auVar65 = maxps(auVar239,auVar201);
        auVar160._0_8_ =
             CONCAT44(fVar188 * local_3a8 +
                      fVar213 * local_338 + fVar203 * local_1f8 + fVar208 * local_368,
                      fVar185 * local_3a8 +
                      fVar210 * local_338 + fVar200 * local_1f8 + fVar206 * local_368) &
             0x7fffffff7fffffff;
        auVar160._8_4_ =
             ABS(fVar195 * local_3a8 +
                 fVar218 * local_338 + fVar204 * local_1f8 + fVar207 * local_368);
        auVar160._12_4_ =
             ABS(fVar197 * local_3a8 +
                 fVar221 * local_338 + fVar205 * local_1f8 + fVar209 * local_368);
        auVar65 = maxps(auVar65,auVar160);
        uVar49 = -(uint)(local_2d8 <= auVar65._0_4_);
        uVar50 = -(uint)(local_2d8 <= auVar65._4_4_);
        uVar51 = -(uint)(local_2d8 <= auVar65._8_4_);
        uVar52 = -(uint)(local_2d8 <= auVar65._12_4_);
        fVar124 = (float)((uint)fVar168 & uVar49 | ~uVar49 & (uint)fVar243);
        fVar126 = (float)((uint)fVar184 & uVar50 | ~uVar50 & (uint)fVar163);
        fVar129 = (float)((uint)fVar186 & uVar51 | ~uVar51 & (uint)fVar165);
        fVar141 = (float)((uint)fVar187 & uVar52 | ~uVar52 & (uint)fVar166);
        fVar185 = (float)(~uVar49 & (uint)local_298 | (uint)fVar86 & uVar49);
        fVar188 = (float)(~uVar50 & (uint)fStack_294 | (uint)fVar98 & uVar50);
        fVar195 = (float)(~uVar51 & (uint)fStack_290 | (uint)fVar100 & uVar51);
        fVar197 = (float)(~uVar52 & (uint)fStack_28c | (uint)fVar101 & uVar52);
        auVar94._0_4_ = fVar162 * fVar162 + fVar142 * fVar142;
        auVar94._4_4_ = fVar164 * fVar164 + fVar150 * fVar150;
        auVar94._8_4_ = fVar167 * fVar167 + fVar151 * fVar151;
        auVar94._12_4_ = fVar183 * fVar183 + fVar152 * fVar152;
        auVar65 = rsqrtps(auVar14,auVar94);
        fVar97 = auVar65._0_4_;
        fVar102 = auVar65._4_4_;
        fVar110 = auVar65._8_4_;
        fVar115 = auVar65._12_4_;
        auVar133._0_4_ = fVar97 * fVar97 * auVar94._0_4_ * 0.5 * fVar97;
        auVar133._4_4_ = fVar102 * fVar102 * auVar94._4_4_ * 0.5 * fVar102;
        auVar133._8_4_ = fVar110 * fVar110 * auVar94._8_4_ * 0.5 * fVar110;
        auVar133._12_4_ = fVar115 * fVar115 * auVar94._12_4_ * 0.5 * fVar115;
        fVar200 = fVar97 * 1.5 - auVar133._0_4_;
        fVar203 = fVar102 * 1.5 - auVar133._4_4_;
        fVar204 = fVar110 * 1.5 - auVar133._8_4_;
        fVar205 = fVar115 * 1.5 - auVar133._12_4_;
        auVar95._0_4_ = fVar185 * fVar185 + fVar124 * fVar124;
        auVar95._4_4_ = fVar188 * fVar188 + fVar126 * fVar126;
        auVar95._8_4_ = fVar195 * fVar195 + fVar129 * fVar129;
        auVar95._12_4_ = fVar197 * fVar197 + fVar141 * fVar141;
        auVar65 = rsqrtps(auVar133,auVar95);
        fVar97 = auVar65._0_4_;
        fVar102 = auVar65._4_4_;
        fVar110 = auVar65._8_4_;
        fVar115 = auVar65._12_4_;
        fVar97 = fVar97 * 1.5 - fVar97 * fVar97 * auVar95._0_4_ * 0.5 * fVar97;
        fVar102 = fVar102 * 1.5 - fVar102 * fVar102 * auVar95._4_4_ * 0.5 * fVar102;
        fVar110 = fVar110 * 1.5 - fVar110 * fVar110 * auVar95._8_4_ * 0.5 * fVar110;
        fVar115 = fVar115 * 1.5 - fVar115 * fVar115 * auVar95._12_4_ * 0.5 * fVar115;
        fVar163 = fVar162 * fVar200 * auVar106._0_4_;
        fVar100 = fVar164 * fVar203 * auVar106._4_4_;
        fVar168 = fVar167 * fVar204 * auVar106._8_4_;
        fVar186 = fVar183 * fVar205 * auVar106._12_4_;
        fVar142 = -fVar142 * fVar200 * auVar106._0_4_;
        fVar150 = -fVar150 * fVar203 * auVar106._4_4_;
        fVar151 = -fVar151 * fVar204 * auVar106._8_4_;
        fVar152 = -fVar152 * fVar205 * auVar106._12_4_;
        fVar246 = fVar200 * 0.0 * auVar106._0_4_;
        fVar247 = fVar203 * 0.0 * auVar106._4_4_;
        fVar248 = fVar204 * 0.0 * auVar106._8_4_;
        fVar249 = fVar205 * 0.0 * auVar106._12_4_;
        fVar212 = fVar185 * fVar97 * (float)local_428._0_4_;
        fVar217 = fVar188 * fVar102 * (float)local_428._4_4_;
        fVar220 = fVar195 * fVar110 * fStack_420;
        fVar223 = fVar197 * fVar115 * fStack_41c;
        fVar166 = (float)local_348._0_4_ + fVar212;
        fVar207 = (float)local_348._4_4_ + fVar217;
        fVar209 = fStack_340 + fVar220;
        fVar210 = fStack_33c + fVar223;
        fVar203 = -fVar124 * fVar97 * (float)local_428._0_4_;
        fVar205 = -fVar126 * fVar102 * (float)local_428._4_4_;
        fVar208 = -fVar129 * fVar110 * fStack_420;
        fVar165 = -fVar141 * fVar115 * fStack_41c;
        fVar213 = fVar189 + fVar203;
        fVar218 = fVar196 + fVar205;
        fVar221 = fVar198 + fVar208;
        fVar86 = fVar199 + fVar165;
        fVar164 = fVar97 * 0.0 * (float)local_428._0_4_;
        fVar183 = fVar102 * 0.0 * (float)local_428._4_4_;
        fVar188 = fVar110 * 0.0 * fStack_420;
        fVar197 = fVar115 * 0.0 * fStack_41c;
        fVar200 = fVar225 - fVar163;
        fVar204 = fVar230 - fVar100;
        fVar206 = fVar232 - fVar168;
        fVar243 = fVar234 - fVar186;
        fVar98 = fVar103 + fVar164;
        fVar101 = fVar111 + fVar183;
        fVar184 = fVar113 + fVar188;
        fVar187 = fVar114 + fVar197;
        fVar124 = fVar231 - fVar142;
        fVar126 = fVar233 - fVar150;
        fVar129 = fVar235 - fVar151;
        fVar141 = fVar242 - fVar152;
        fVar162 = fVar116 - fVar246;
        fVar167 = fVar125 - fVar247;
        fVar185 = fVar127 - fVar248;
        fVar195 = fVar128 - fVar249;
        uVar49 = -(uint)(0.0 < (fVar124 * (fVar98 - fVar162) - fVar162 * (fVar213 - fVar124)) * 0.0
                               + (fVar162 * (fVar166 - fVar200) - (fVar98 - fVar162) * fVar200) *
                                 0.0 + ((fVar213 - fVar124) * fVar200 -
                                       (fVar166 - fVar200) * fVar124));
        uVar50 = -(uint)(0.0 < (fVar126 * (fVar101 - fVar167) - fVar167 * (fVar218 - fVar126)) * 0.0
                               + (fVar167 * (fVar207 - fVar204) - (fVar101 - fVar167) * fVar204) *
                                 0.0 + ((fVar218 - fVar126) * fVar204 -
                                       (fVar207 - fVar204) * fVar126));
        uVar51 = -(uint)(0.0 < (fVar129 * (fVar184 - fVar185) - fVar185 * (fVar221 - fVar129)) * 0.0
                               + (fVar185 * (fVar209 - fVar206) - (fVar184 - fVar185) * fVar206) *
                                 0.0 + ((fVar221 - fVar129) * fVar206 -
                                       (fVar209 - fVar206) * fVar129));
        uVar52 = -(uint)(0.0 < (fVar141 * (fVar187 - fVar195) - fVar195 * (fVar86 - fVar141)) * 0.0
                               + (fVar195 * (fVar210 - fVar243) - (fVar187 - fVar195) * fVar243) *
                                 0.0 + ((fVar86 - fVar141) * fVar243 - (fVar210 - fVar243) * fVar141
                                       ));
        fVar97 = (float)((uint)((float)local_348._0_4_ - fVar212) & uVar49 |
                        ~uVar49 & (uint)(fVar225 + fVar163));
        fVar102 = (float)((uint)((float)local_348._4_4_ - fVar217) & uVar50 |
                         ~uVar50 & (uint)(fVar230 + fVar100));
        fVar110 = (float)((uint)(fStack_340 - fVar220) & uVar51 |
                         ~uVar51 & (uint)(fVar232 + fVar168));
        fVar115 = (float)((uint)(fStack_33c - fVar223) & uVar52 |
                         ~uVar52 & (uint)(fVar234 + fVar186));
        fVar163 = (float)((uint)(fVar189 - fVar203) & uVar49 | ~uVar49 & (uint)(fVar231 + fVar142));
        fVar233 = (float)((uint)(fVar196 - fVar205) & uVar50 | ~uVar50 & (uint)(fVar233 + fVar150));
        fVar235 = (float)((uint)(fVar198 - fVar208) & uVar51 | ~uVar51 & (uint)(fVar235 + fVar151));
        fVar242 = (float)((uint)(fVar199 - fVar165) & uVar52 | ~uVar52 & (uint)(fVar242 + fVar152));
        fVar100 = (float)((uint)(fVar103 - fVar164) & uVar49 | ~uVar49 & (uint)(fVar116 + fVar246));
        fVar103 = (float)((uint)(fVar111 - fVar183) & uVar50 | ~uVar50 & (uint)(fVar125 + fVar247));
        fVar111 = (float)((uint)(fVar113 - fVar188) & uVar51 | ~uVar51 & (uint)(fVar127 + fVar248));
        fVar113 = (float)((uint)(fVar114 - fVar197) & uVar52 | ~uVar52 & (uint)(fVar128 + fVar249));
        fVar203 = (float)((uint)fVar200 & uVar49 | ~uVar49 & (uint)fVar166);
        fVar205 = (float)((uint)fVar204 & uVar50 | ~uVar50 & (uint)fVar207);
        fVar208 = (float)((uint)fVar206 & uVar51 | ~uVar51 & (uint)fVar209);
        fVar231 = (float)((uint)fVar243 & uVar52 | ~uVar52 & (uint)fVar210);
        fVar142 = (float)((uint)fVar124 & uVar49 | ~uVar49 & (uint)fVar213);
        fVar150 = (float)((uint)fVar126 & uVar50 | ~uVar50 & (uint)fVar218);
        fVar151 = (float)((uint)fVar129 & uVar51 | ~uVar51 & (uint)fVar221);
        fVar152 = (float)((uint)fVar141 & uVar52 | ~uVar52 & (uint)fVar86);
        fVar164 = (float)((uint)fVar162 & uVar49 | ~uVar49 & (uint)fVar98);
        fVar183 = (float)((uint)fVar167 & uVar50 | ~uVar50 & (uint)fVar101);
        fVar188 = (float)((uint)fVar185 & uVar51 | ~uVar51 & (uint)fVar184);
        fVar197 = (float)((uint)fVar195 & uVar52 | ~uVar52 & (uint)fVar187);
        fVar200 = (float)((uint)fVar166 & uVar49 | ~uVar49 & (uint)fVar200) - fVar97;
        fVar204 = (float)((uint)fVar207 & uVar50 | ~uVar50 & (uint)fVar204) - fVar102;
        fVar206 = (float)((uint)fVar209 & uVar51 | ~uVar51 & (uint)fVar206) - fVar110;
        fVar243 = (float)((uint)fVar210 & uVar52 | ~uVar52 & (uint)fVar243) - fVar115;
        fVar165 = (float)((uint)fVar213 & uVar49 | ~uVar49 & (uint)fVar124) - fVar163;
        fVar166 = (float)((uint)fVar218 & uVar50 | ~uVar50 & (uint)fVar126) - fVar233;
        fVar189 = (float)((uint)fVar221 & uVar51 | ~uVar51 & (uint)fVar129) - fVar235;
        fVar196 = (float)((uint)fVar86 & uVar52 | ~uVar52 & (uint)fVar141) - fVar242;
        fVar198 = (float)((uint)fVar98 & uVar49 | ~uVar49 & (uint)fVar162) - fVar100;
        fVar199 = (float)((uint)fVar101 & uVar50 | ~uVar50 & (uint)fVar167) - fVar103;
        fVar225 = (float)((uint)fVar184 & uVar51 | ~uVar51 & (uint)fVar185) - fVar111;
        fVar230 = (float)((uint)fVar187 & uVar52 | ~uVar52 & (uint)fVar195) - fVar113;
        fVar210 = fVar97 - fVar203;
        fVar213 = fVar102 - fVar205;
        fVar218 = fVar110 - fVar208;
        fVar221 = fVar115 - fVar231;
        fVar162 = fVar163 - fVar142;
        fVar167 = fVar233 - fVar150;
        fVar185 = fVar235 - fVar151;
        fVar195 = fVar242 - fVar152;
        fVar124 = fVar100 - fVar164;
        fVar126 = fVar103 - fVar183;
        fVar129 = fVar111 - fVar188;
        fVar141 = fVar113 - fVar197;
        fVar232 = (fVar163 * fVar198 - fVar100 * fVar165) * 0.0 +
                  (fVar100 * fVar200 - fVar97 * fVar198) * 0.0 +
                  (fVar97 * fVar165 - fVar163 * fVar200);
        fVar234 = (fVar233 * fVar199 - fVar103 * fVar166) * 0.0 +
                  (fVar103 * fVar204 - fVar102 * fVar199) * 0.0 +
                  (fVar102 * fVar166 - fVar233 * fVar204);
        auVar120._4_4_ = fVar234;
        auVar120._0_4_ = fVar232;
        fVar207 = (fVar235 * fVar225 - fVar111 * fVar189) * 0.0 +
                  (fVar111 * fVar206 - fVar110 * fVar225) * 0.0 +
                  (fVar110 * fVar189 - fVar235 * fVar206);
        fVar209 = (fVar242 * fVar230 - fVar113 * fVar196) * 0.0 +
                  (fVar113 * fVar243 - fVar115 * fVar230) * 0.0 +
                  (fVar115 * fVar196 - fVar242 * fVar243);
        auVar244._0_4_ =
             (fVar142 * fVar124 - fVar164 * fVar162) * 0.0 +
             (fVar164 * fVar210 - fVar203 * fVar124) * 0.0 + (fVar203 * fVar162 - fVar142 * fVar210)
        ;
        auVar244._4_4_ =
             (fVar150 * fVar126 - fVar183 * fVar167) * 0.0 +
             (fVar183 * fVar213 - fVar205 * fVar126) * 0.0 + (fVar205 * fVar167 - fVar150 * fVar213)
        ;
        auVar244._8_4_ =
             (fVar151 * fVar129 - fVar188 * fVar185) * 0.0 +
             (fVar188 * fVar218 - fVar208 * fVar129) * 0.0 + (fVar208 * fVar185 - fVar151 * fVar218)
        ;
        auVar244._12_4_ =
             (fVar152 * fVar141 - fVar197 * fVar195) * 0.0 +
             (fVar197 * fVar221 - fVar231 * fVar141) * 0.0 + (fVar231 * fVar195 - fVar152 * fVar221)
        ;
        auVar120._8_4_ = fVar207;
        auVar120._12_4_ = fVar209;
        auVar65 = maxps(auVar120,auVar244);
        bVar32 = auVar65._0_4_ <= 0.0 && bVar32;
        auVar121._0_4_ = -(uint)bVar32;
        bVar33 = auVar65._4_4_ <= 0.0 && bVar33;
        auVar121._4_4_ = -(uint)bVar33;
        bVar31 = auVar65._8_4_ <= 0.0 && bVar31;
        auVar121._8_4_ = -(uint)bVar31;
        bVar48 = auVar65._12_4_ <= 0.0 && bVar48;
        auVar121._12_4_ = -(uint)bVar48;
        iVar35 = movmskps(iVar35,auVar121);
        if (iVar35 == 0) {
LAB_00b65075:
          auVar79._8_8_ = uStack_310;
          auVar79._0_8_ = local_318;
        }
        else {
          fVar142 = ray->tfar;
          auVar134._0_4_ = fVar124 * fVar165;
          auVar134._4_4_ = fVar126 * fVar166;
          auVar134._8_4_ = fVar129 * fVar189;
          auVar134._12_4_ = fVar141 * fVar196;
          fVar164 = fVar162 * fVar198 - auVar134._0_4_;
          fVar183 = fVar167 * fVar199 - auVar134._4_4_;
          fVar188 = fVar185 * fVar225 - auVar134._8_4_;
          fVar197 = fVar195 * fVar230 - auVar134._12_4_;
          fVar124 = fVar124 * fVar200 - fVar198 * fVar210;
          fVar150 = fVar126 * fVar204 - fVar199 * fVar213;
          fVar151 = fVar129 * fVar206 - fVar225 * fVar218;
          fVar152 = fVar141 * fVar243 - fVar230 * fVar221;
          fVar200 = fVar210 * fVar165 - fVar162 * fVar200;
          fVar167 = fVar213 * fVar166 - fVar167 * fVar204;
          fVar185 = fVar218 * fVar189 - fVar185 * fVar206;
          fVar195 = fVar221 * fVar196 - fVar195 * fVar243;
          auVar145._0_4_ = fVar164 * 0.0 + fVar124 * 0.0 + fVar200;
          auVar145._4_4_ = fVar183 * 0.0 + fVar150 * 0.0 + fVar167;
          auVar145._8_4_ = fVar188 * 0.0 + fVar151 * 0.0 + fVar185;
          auVar145._12_4_ = fVar197 * 0.0 + fVar152 * 0.0 + fVar195;
          auVar65 = rcpps(auVar134,auVar145);
          fVar126 = auVar65._0_4_;
          fVar129 = auVar65._4_4_;
          fVar141 = auVar65._8_4_;
          fVar162 = auVar65._12_4_;
          fVar126 = (1.0 - auVar145._0_4_ * fVar126) * fVar126 + fVar126;
          fVar129 = (1.0 - auVar145._4_4_ * fVar129) * fVar129 + fVar129;
          fVar141 = (1.0 - auVar145._8_4_ * fVar141) * fVar141 + fVar141;
          fVar162 = (1.0 - auVar145._12_4_ * fVar162) * fVar162 + fVar162;
          fVar97 = (fVar100 * fVar200 + fVar163 * fVar124 + fVar97 * fVar164) * fVar126;
          fVar102 = (fVar103 * fVar167 + fVar233 * fVar150 + fVar102 * fVar183) * fVar129;
          auVar146._4_4_ = fVar102;
          auVar146._0_4_ = fVar97;
          fVar110 = (fVar111 * fVar185 + fVar235 * fVar151 + fVar110 * fVar188) * fVar141;
          fVar115 = (fVar113 * fVar195 + fVar242 * fVar152 + fVar115 * fVar197) * fVar162;
          bVar32 = (fVar84 <= fVar97 && fVar97 <= fVar142) && bVar32;
          auVar135._0_4_ = -(uint)bVar32;
          bVar33 = (fVar84 <= fVar102 && fVar102 <= fVar142) && bVar33;
          auVar135._4_4_ = -(uint)bVar33;
          bVar31 = (fVar84 <= fVar110 && fVar110 <= fVar142) && bVar31;
          auVar135._8_4_ = -(uint)bVar31;
          bVar48 = (fVar84 <= fVar115 && fVar115 <= fVar142) && bVar48;
          auVar135._12_4_ = -(uint)bVar48;
          iVar35 = movmskps(iVar35,auVar135);
          if (iVar35 == 0) goto LAB_00b65075;
          auVar136._0_8_ =
               CONCAT44(-(uint)(auVar145._4_4_ != 0.0 && bVar33),
                        -(uint)(auVar145._0_4_ != 0.0 && bVar32));
          auVar136._8_4_ = -(uint)(auVar145._8_4_ != 0.0 && bVar31);
          auVar136._12_4_ = -(uint)(auVar145._12_4_ != 0.0 && bVar48);
          iVar35 = movmskps(iVar35,auVar136);
          auVar79._8_8_ = uStack_310;
          auVar79._0_8_ = local_318;
          if (iVar35 != 0) {
            fVar232 = fVar232 * fVar126;
            fVar234 = fVar234 * fVar129;
            fVar207 = fVar207 * fVar141;
            fVar209 = fVar209 * fVar162;
            local_58 = (float)((uint)(1.0 - fVar232) & uVar49 | ~uVar49 & (uint)fVar232);
            fStack_54 = (float)((uint)(1.0 - fVar234) & uVar50 | ~uVar50 & (uint)fVar234);
            fStack_50 = (float)((uint)(1.0 - fVar207) & uVar51 | ~uVar51 & (uint)fVar207);
            fStack_4c = (float)((uint)(1.0 - fVar209) & uVar52 | ~uVar52 & (uint)fVar209);
            local_1d8 = (float)(~uVar49 & (uint)(auVar244._0_4_ * fVar126) |
                               (uint)(1.0 - auVar244._0_4_ * fVar126) & uVar49);
            fStack_1d4 = (float)(~uVar50 & (uint)(auVar244._4_4_ * fVar129) |
                                (uint)(1.0 - auVar244._4_4_ * fVar129) & uVar50);
            fStack_1d0 = (float)(~uVar51 & (uint)(auVar244._8_4_ * fVar141) |
                                (uint)(1.0 - auVar244._8_4_ * fVar141) & uVar51);
            fStack_1cc = (float)(~uVar52 & (uint)(auVar244._12_4_ * fVar162) |
                                (uint)(1.0 - auVar244._12_4_ * fVar162) & uVar52);
            auVar79._8_4_ = auVar136._8_4_;
            auVar79._0_8_ = auVar136._0_8_;
            auVar79._12_4_ = auVar136._12_4_;
            auVar146._8_4_ = fVar110;
            auVar146._12_4_ = fVar115;
            local_3e8 = auVar146;
          }
        }
        _Stack_3f0 = (((atomic<unsigned_long> *)(ppp_Var3 + 1))->super___atomic_base<unsigned_long>)
                     ._M_i;
        local_3f8 = *ppp_Var3;
        uStack_410 = (((atomic<unsigned_long> *)(ppp_Var2 + 1))->super___atomic_base<unsigned_long>)
                     ._M_i;
        local_418 = *ppp_Var2;
        _Stack_130 = (((atomic<unsigned_long> *)(ppp_Var1 + 1))->super___atomic_base<unsigned_long>)
                     ._M_i;
        local_138 = *ppp_Var1;
        _local_388 = *(undefined1 (*) [16])ppp_Var1;
        iVar35 = movmskps(iVar35,auVar79);
        if (iVar35 == 0) goto LAB_00b65021;
        fVar102 = ((float)local_428._0_4_ - auVar106._0_4_) * local_58 + auVar106._0_4_;
        fVar110 = ((float)local_428._4_4_ - auVar106._4_4_) * fStack_54 + auVar106._4_4_;
        fVar115 = (fStack_420 - auVar106._8_4_) * fStack_50 + auVar106._8_4_;
        fVar124 = (fStack_41c - auVar106._12_4_) * fStack_4c + auVar106._12_4_;
        fVar97 = pre->depth_scale;
        local_108._0_4_ = -(uint)(fVar97 * (fVar102 + fVar102) < local_3e8._0_4_) & auVar79._0_4_;
        local_108._4_4_ = -(uint)(fVar97 * (fVar110 + fVar110) < local_3e8._4_4_) & auVar79._4_4_;
        local_108._8_4_ = -(uint)(fVar97 * (fVar115 + fVar115) < local_3e8._8_4_) & auVar79._8_4_;
        local_108._12_4_ = -(uint)(fVar97 * (fVar124 + fVar124) < local_3e8._12_4_) & auVar79._12_4_
        ;
        iVar35 = movmskps(iVar35,local_108);
        if (iVar35 == 0) {
LAB_00b65009:
          bVar48 = false;
        }
        else {
          local_1d8 = local_1d8 + local_1d8 + -1.0;
          fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
          fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
          fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
          local_188 = local_58;
          fStack_184 = fStack_54;
          fStack_180 = fStack_50;
          fStack_17c = fStack_4c;
          local_158 = 0;
          if ((pGVar11->mask & ray->mask) == 0) goto LAB_00b65009;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar48 = true, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            fVar85 = 1.0 / fVar85;
            local_f8[0] = fVar85 * (local_58 + 0.0);
            local_f8[1] = fVar85 * (fStack_54 + 1.0);
            local_f8[2] = fVar85 * (fStack_50 + 2.0);
            local_f8[3] = fVar85 * (fStack_4c + 3.0);
            local_e8 = CONCAT44(fStack_1d4,local_1d8);
            uStack_e0 = CONCAT44(fStack_1cc,fStack_1d0);
            local_d8 = local_3e8;
            bVar40 = (byte)iVar35;
            lVar43 = 0;
            if ((Geometry *)(ulong)bVar40 != (Geometry *)0x0) {
              for (; (bVar40 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            bVar48 = true;
            auVar37 = (undefined1  [8])(ulong)bVar40;
            _local_398 = auVar119;
            _local_1c8 = *pauVar4;
            local_178 = local_1d8;
            fStack_174 = fStack_1d4;
            fStack_170 = fStack_1d0;
            fStack_16c = fStack_1cc;
            _local_168 = local_3e8;
            local_154 = iVar10;
            local_148 = fVar112;
            fStack_144 = fVar54;
            fStack_140 = fVar83;
            fStack_13c = fStack_3cc;
            local_128 = local_418;
            _Stack_120 = uStack_410;
            local_118 = local_3f8;
            _Stack_110 = _Stack_3f0;
            do {
              local_26c = local_f8[lVar43];
              local_268 = *(undefined4 *)((long)&local_e8 + lVar43 * 4);
              local_348._0_4_ = ray->tfar;
              local_428 = (undefined1  [8])lVar43;
              ray->tfar = *(float *)(local_d8 + lVar43 * 4);
              fVar84 = 1.0 - local_26c;
              fVar97 = local_26c * 3.0;
              fVar102 = ((fVar97 + 2.0) * (fVar84 + fVar84) + fVar84 * -3.0 * fVar84) * 0.5;
              fVar85 = (fVar84 * -2.0 * local_26c + local_26c * local_26c) * 0.5;
              fVar97 = (local_26c * fVar97 + (fVar97 + -5.0) * (local_26c + local_26c)) * 0.5;
              fVar84 = (local_26c * (fVar84 + fVar84) - fVar84 * fVar84) * 0.5;
              local_278 = CONCAT44(fVar84 * fVar54 +
                                   fVar97 * (float)local_388._4_4_ +
                                   fVar102 * local_418._4_4_ + fVar85 * local_3f8._4_4_,
                                   fVar84 * fVar112 +
                                   fVar97 * (float)local_388._0_4_ +
                                   fVar102 * (float)local_418 + fVar85 * (float)local_3f8);
              local_270 = fVar84 * fVar83 +
                          fVar97 * (float)uStack_380 +
                          fVar102 * (float)uStack_410 + fVar85 * (float)_Stack_3f0._0_4_;
              local_2c8.context = context->user;
              local_264 = (undefined4)local_240;
              local_260 = (undefined4)local_320;
              local_25c = (local_2c8.context)->instID[0];
              local_258 = (local_2c8.context)->instPrimID[0];
              local_42c = (undefined1  [4])0xffffffff;
              local_2c8.valid = (int *)local_42c;
              local_2c8.geometryUserPtr = pGVar11->userPtr;
              local_2c8.hit = (RTCHitN *)&local_278;
              local_2c8.N = 1;
              local_2c8.ray = (RTCRayN *)ray;
              if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar11->occlusionFilterN)(&local_2c8), context = local_3c0, pre = local_350,
                 fVar112 = local_3d8, fVar54 = fStack_3d4, fVar83 = fStack_3d0, fVar99 = local_408,
                 fVar211 = fStack_404, fVar216 = fStack_400, fVar219 = fStack_3fc,
                 fVar143 = local_378, fVar222 = fStack_374, fVar224 = fStack_370,
                 fVar229 = fStack_36c, *(int *)&((RefCount *)local_2c8.valid)->_vptr_RefCount != 0))
              {
                pGVar44 = (Geometry *)context->args->filter;
                if (pGVar44 == (Geometry *)0x0) break;
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar11->field_8).field_0x2 & 0x40) != 0))
                {
                  (*(code *)pGVar44)(&local_2c8);
                  context = local_3c0;
                  pre = local_350;
                  fVar112 = local_3d8;
                  fVar54 = fStack_3d4;
                  fVar83 = fStack_3d0;
                  fVar99 = local_408;
                  fVar211 = fStack_404;
                  fVar216 = fStack_400;
                  fVar219 = fStack_3fc;
                  fVar143 = local_378;
                  fVar222 = fStack_374;
                  fVar224 = fStack_370;
                  fVar229 = fStack_36c;
                }
                pGVar44 = (Geometry *)local_2c8.valid;
                if (*(int *)&((RefCount *)local_2c8.valid)->_vptr_RefCount != 0) break;
              }
              ray->tfar = (float)local_348._0_4_;
              pGVar44 = (Geometry *)((ulong)auVar37 ^ 1L << ((ulong)local_428 & 0x3f));
              lVar43 = 0;
              if (pGVar44 != (Geometry *)0x0) {
                for (; ((ulong)pGVar44 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                }
              }
              bVar48 = pGVar44 != (Geometry *)0x0;
              auVar37 = (undefined1  [8])pGVar44;
            } while (bVar48);
            iVar35 = (int)pGVar44;
            local_3c0 = context;
            local_350 = pre;
            fStack_364 = fStack_364;
            fStack_360 = fStack_360;
            fStack_35c = fStack_35c;
            fVar84 = (float)local_228._0_4_;
            fVar85 = (float)local_238._0_4_;
          }
        }
      }
      local_238._0_4_ = fVar85;
      local_228._0_4_ = fVar84;
      if (4 < iVar10) {
        local_68 = iVar10;
        iStack_64 = iVar10;
        iStack_60 = iVar10;
        iStack_5c = iVar10;
        local_228._4_4_ = local_228._0_4_;
        fStack_220 = (float)local_228._0_4_;
        fStack_21c = (float)local_228._0_4_;
        local_238._4_4_ = 1.0 / (float)local_238._0_4_;
        local_238._0_4_ = local_238._4_4_;
        fStack_230 = (float)local_238._4_4_;
        fStack_22c = (float)local_238._4_4_;
        lVar43 = 4;
        fStack_2d4 = local_2d8;
        fStack_2d0 = local_2d8;
        fStack_2cc = local_2d8;
        do {
          local_158 = (uint)lVar43;
          pauVar5 = (undefined1 (*) [12])(catmullrom_basis0 + lVar43 * 4 + lVar12);
          fVar112 = *(float *)*pauVar5;
          fVar54 = *(float *)(*pauVar5 + 4);
          fVar83 = *(float *)(*pauVar5 + 8);
          auVar17 = *pauVar5;
          fVar84 = *(float *)pauVar5[1];
          pauVar5 = (undefined1 (*) [12])(lVar12 + 0x22307f0 + lVar43 * 4);
          fVar85 = *(float *)*pauVar5;
          fVar97 = *(float *)(*pauVar5 + 4);
          fVar102 = *(float *)(*pauVar5 + 8);
          auVar16 = *pauVar5;
          fVar110 = *(float *)pauVar5[1];
          pfVar7 = (float *)(lVar12 + 0x2230c74 + lVar43 * 4);
          local_298 = *pfVar7;
          fStack_294 = pfVar7[1];
          fStack_290 = pfVar7[2];
          fStack_28c = pfVar7[3];
          pfVar7 = (float *)(lVar12 + 0x22310f8 + lVar43 * 4);
          fVar115 = *pfVar7;
          fVar124 = pfVar7[1];
          fVar126 = pfVar7[2];
          fVar129 = pfVar7[3];
          fVar163 = local_198 * fVar112 +
                    local_1a8 * fVar85 + local_3b8 * local_298 + local_208 * fVar115;
          fVar165 = fStack_194 * fVar54 +
                    fStack_1a4 * fVar97 + fStack_3b4 * fStack_294 + fStack_204 * fVar124;
          fVar166 = fStack_190 * fVar83 +
                    fStack_1a0 * fVar102 + fStack_3b0 * fStack_290 + fStack_200 * fVar126;
          fVar189 = fStack_18c * fVar84 +
                    fStack_19c * fVar110 + fStack_3ac * fStack_28c + fStack_1fc * fVar129;
          fVar203 = local_218 * fVar112 +
                    local_1b8 * fVar85 + fVar143 * local_298 + fVar99 * fVar115;
          fVar204 = fStack_214 * fVar54 +
                    fStack_1b4 * fVar97 + fVar222 * fStack_294 + fVar211 * fVar124;
          fVar206 = fStack_210 * fVar83 +
                    fStack_1b0 * fVar102 + fVar224 * fStack_290 + fVar216 * fVar126;
          fVar231 = fStack_20c * fVar84 +
                    fStack_1ac * fVar110 + fVar229 * fStack_28c + fVar219 * fVar129;
          fVar188 = local_a8 * fVar112 +
                    local_98 * fVar85 + local_78 * local_298 + local_88 * fVar115;
          fVar195 = fStack_a4 * fVar54 +
                    fStack_94 * fVar97 + fStack_74 * fStack_294 + fStack_84 * fVar124;
          fVar197 = fStack_a0 * fVar83 +
                    fStack_90 * fVar102 + fStack_70 * fStack_290 + fStack_80 * fVar126;
          fVar200 = fStack_9c * fVar84 +
                    fStack_8c * fVar110 + fStack_6c * fStack_28c + fStack_7c * fVar129;
          puVar38 = catmullrom_basis1 + lVar12;
          pfVar7 = (float *)(puVar38 + lVar43 * 4);
          fVar112 = *pfVar7;
          fVar54 = pfVar7[1];
          fVar83 = pfVar7[2];
          fVar85 = pfVar7[3];
          pfVar7 = (float *)(lVar12 + 0x2232c10 + lVar43 * 4);
          fVar97 = *pfVar7;
          fVar102 = pfVar7[1];
          fVar141 = pfVar7[2];
          fVar142 = pfVar7[3];
          pfVar7 = (float *)(lVar12 + 0x2233094 + lVar43 * 4);
          fVar150 = *pfVar7;
          fVar151 = pfVar7[1];
          fVar152 = pfVar7[2];
          fVar162 = pfVar7[3];
          pfVar7 = (float *)(lVar12 + 0x2233518 + lVar43 * 4);
          fVar164 = *pfVar7;
          fVar167 = pfVar7[1];
          fVar183 = pfVar7[2];
          fVar185 = pfVar7[3];
          fStack_340 = fVar197;
          local_348 = (undefined1  [8])CONCAT44(fVar195,fVar188);
          fStack_33c = fVar200;
          fVar233 = local_198 * fVar112 +
                    local_1a8 * fVar97 + local_3b8 * fVar150 + local_208 * fVar164;
          fVar235 = fStack_194 * fVar54 +
                    fStack_1a4 * fVar102 + fStack_3b4 * fVar151 + fStack_204 * fVar167;
          fVar242 = fStack_190 * fVar83 +
                    fStack_1a0 * fVar141 + fStack_3b0 * fVar152 + fStack_200 * fVar183;
          fVar243 = fStack_18c * fVar85 +
                    fStack_19c * fVar142 + fStack_3ac * fVar162 + fStack_1fc * fVar185;
          fVar196 = local_218 * fVar112 + local_1b8 * fVar97 + fVar143 * fVar150 + fVar99 * fVar164;
          fVar198 = fStack_214 * fVar54 +
                    fStack_1b4 * fVar102 + fVar222 * fVar151 + fVar211 * fVar167;
          fVar216 = fStack_210 * fVar83 +
                    fStack_1b0 * fVar141 + fVar224 * fVar152 + fVar216 * fVar183;
          fVar219 = fStack_20c * fVar85 +
                    fStack_1ac * fVar142 + fVar229 * fVar162 + fVar219 * fVar185;
          auVar202._0_4_ =
               local_a8 * fVar112 + local_98 * fVar97 + local_78 * fVar150 + local_88 * fVar164;
          auVar202._4_4_ =
               fStack_a4 * fVar54 + fStack_94 * fVar102 + fStack_74 * fVar151 + fStack_84 * fVar167;
          auVar202._8_4_ =
               fStack_a0 * fVar83 + fStack_90 * fVar141 + fStack_70 * fVar152 + fStack_80 * fVar183;
          auVar202._12_4_ =
               fStack_9c * fVar85 + fStack_8c * fVar142 + fStack_6c * fVar162 + fStack_7c * fVar185;
          fVar234 = fVar233 - fVar163;
          fVar207 = fVar235 - fVar165;
          fVar209 = fVar242 - fVar166;
          fVar210 = fVar243 - fVar189;
          fVar199 = fVar196 - fVar203;
          fVar225 = fVar198 - fVar204;
          fVar230 = fVar216 - fVar206;
          fVar232 = fVar219 - fVar231;
          fVar99 = fVar203 * fVar234 - fVar163 * fVar199;
          fVar205 = fVar204 * fVar207 - fVar165 * fVar225;
          fVar208 = fVar206 * fVar209 - fVar166 * fVar230;
          fVar211 = fVar231 * fVar210 - fVar189 * fVar232;
          auVar194._8_4_ = fVar197;
          auVar194._0_8_ = CONCAT44(fVar195,fVar188);
          auVar194._12_4_ = fVar200;
          auVar65 = maxps(auVar194,auVar202);
          bVar33 = fVar99 * fVar99 <=
                   auVar65._0_4_ * auVar65._0_4_ * (fVar234 * fVar234 + fVar199 * fVar199) &&
                   (int)local_158 < local_68;
          local_1c8._0_4_ = -(uint)bVar33;
          bVar34 = fVar205 * fVar205 <=
                   auVar65._4_4_ * auVar65._4_4_ * (fVar207 * fVar207 + fVar225 * fVar225) &&
                   (int)(local_158 | 1) < iStack_64;
          local_1c8._4_4_ = -(uint)bVar34;
          bVar32 = fVar208 * fVar208 <=
                   auVar65._8_4_ * auVar65._8_4_ * (fVar209 * fVar209 + fVar230 * fVar230) &&
                   (int)(local_158 | 2) < iStack_60;
          fStack_1c0 = (float)-(uint)bVar32;
          bVar31 = fVar211 * fVar211 <=
                   auVar65._12_4_ * auVar65._12_4_ * (fVar210 * fVar210 + fVar232 * fVar232) &&
                   (int)(local_158 | 3) < iStack_5c;
          register0x0000124c = -(uint)bVar31;
          uVar49 = movmskps(SUB84(auVar37,0),_local_1c8);
          auVar37 = (undefined1  [8])(ulong)uVar49;
          if (uVar49 == 0) {
LAB_00b65ec1:
            iVar35 = (int)puVar38;
          }
          else {
            fVar221 = fVar164 * local_368 + fVar150 * local_1f8 + fVar97 * local_338 +
                      fVar112 * local_3a8;
            fVar86 = fVar167 * fStack_364 + fVar151 * fStack_1f4 + fVar102 * fStack_334 +
                     fVar54 * fStack_3a4;
            fVar98 = fVar183 * fStack_360 + fVar152 * fStack_1f0 + fVar141 * fStack_330 +
                     fVar83 * fStack_3a0;
            fVar100 = fVar185 * fStack_35c + fVar162 * fStack_1ec + fVar142 * fStack_32c +
                      fVar85 * fStack_39c;
            local_428._0_4_ = auVar17._0_4_;
            local_428._4_4_ = auVar17._4_4_;
            fStack_420 = auVar17._8_4_;
            local_398._0_4_ = auVar16._0_4_;
            local_398._4_4_ = auVar16._4_4_;
            uStack_390._0_4_ = auVar16._8_4_;
            fVar114 = fVar115 * local_368 + local_298 * local_1f8 +
                      (float)local_398._0_4_ * local_338 + (float)local_428._0_4_ * local_3a8;
            fVar116 = fVar124 * fStack_364 + fStack_294 * fStack_1f4 +
                      (float)local_398._4_4_ * fStack_334 + (float)local_428._4_4_ * fStack_3a4;
            fVar125 = fVar126 * fStack_360 + fStack_290 * fStack_1f0 +
                      (float)uStack_390 * fStack_330 + fStack_420 * fStack_3a0;
            fVar127 = fVar129 * fStack_35c + fStack_28c * fStack_1ec + fVar110 * fStack_32c +
                      fVar84 * fStack_39c;
            pfVar7 = (float *)(lVar12 + 0x223157c + lVar43 * 4);
            fVar112 = *pfVar7;
            fVar54 = pfVar7[1];
            fVar83 = pfVar7[2];
            fVar84 = pfVar7[3];
            pfVar7 = (float *)(lVar12 + 0x2231a00 + lVar43 * 4);
            fVar85 = *pfVar7;
            fVar97 = pfVar7[1];
            fVar99 = pfVar7[2];
            fVar102 = pfVar7[3];
            pfVar7 = (float *)(lVar12 + 0x2231e84 + lVar43 * 4);
            fVar110 = *pfVar7;
            fVar115 = pfVar7[1];
            fVar124 = pfVar7[2];
            fVar126 = pfVar7[3];
            pfVar7 = (float *)(lVar12 + 0x2232308 + lVar43 * 4);
            fVar129 = *pfVar7;
            fVar141 = pfVar7[1];
            fVar142 = pfVar7[2];
            fVar150 = pfVar7[3];
            fVar187 = local_198 * fVar112 +
                      local_1a8 * fVar85 + local_3b8 * fVar110 + local_208 * fVar129;
            fVar212 = fStack_194 * fVar54 +
                      fStack_1a4 * fVar97 + fStack_3b4 * fVar115 + fStack_204 * fVar141;
            fVar217 = fStack_190 * fVar83 +
                      fStack_1a0 * fVar99 + fStack_3b0 * fVar124 + fStack_200 * fVar142;
            fVar220 = fStack_18c * fVar84 +
                      fStack_19c * fVar102 + fStack_3ac * fVar126 + fStack_1fc * fVar150;
            fVar101 = local_218 * fVar112 +
                      local_1b8 * fVar85 + fVar143 * fVar110 + local_408 * fVar129;
            fVar103 = fStack_214 * fVar54 +
                      fStack_1b4 * fVar97 + fVar222 * fVar115 + fStack_404 * fVar141;
            fVar111 = fStack_210 * fVar83 +
                      fStack_1b0 * fVar99 + fVar224 * fVar124 + fStack_400 * fVar142;
            fVar113 = fStack_20c * fVar84 +
                      fStack_1ac * fVar102 + fVar229 * fVar126 + fStack_3fc * fVar150;
            pfVar7 = (float *)(lVar12 + 0x223399c + lVar43 * 4);
            fVar143 = *pfVar7;
            fVar151 = pfVar7[1];
            fVar152 = pfVar7[2];
            fVar162 = pfVar7[3];
            pfVar7 = (float *)(lVar12 + 0x22342a4 + lVar43 * 4);
            fVar164 = *pfVar7;
            fVar167 = pfVar7[1];
            fVar183 = pfVar7[2];
            fVar185 = pfVar7[3];
            pfVar7 = (float *)(lVar12 + 0x2234728 + lVar43 * 4);
            fVar205 = *pfVar7;
            fVar208 = pfVar7[1];
            fVar211 = pfVar7[2];
            fVar222 = pfVar7[3];
            pfVar7 = (float *)(lVar12 + 0x2233e20 + lVar43 * 4);
            fVar224 = *pfVar7;
            fVar229 = pfVar7[1];
            fVar213 = pfVar7[2];
            fVar218 = pfVar7[3];
            fVar223 = local_198 * fVar143 +
                      local_1a8 * fVar224 + local_3b8 * fVar164 + local_208 * fVar205;
            fVar246 = fStack_194 * fVar151 +
                      fStack_1a4 * fVar229 + fStack_3b4 * fVar167 + fStack_204 * fVar208;
            fVar247 = fStack_190 * fVar152 +
                      fStack_1a0 * fVar213 + fStack_3b0 * fVar183 + fStack_200 * fVar211;
            fVar248 = fStack_18c * fVar162 +
                      fStack_19c * fVar218 + fStack_3ac * fVar185 + fStack_1fc * fVar222;
            fVar128 = local_218 * fVar143 +
                      local_1b8 * fVar224 + local_378 * fVar164 + local_408 * fVar205;
            fVar168 = fStack_214 * fVar151 +
                      fStack_1b4 * fVar229 + fStack_374 * fVar167 + fStack_404 * fVar208;
            fVar184 = fStack_210 * fVar152 +
                      fStack_1b0 * fVar213 + fStack_370 * fVar183 + fStack_400 * fVar211;
            fVar186 = fStack_20c * fVar162 +
                      fStack_1ac * fVar218 + fStack_36c * fVar185 + fStack_3fc * fVar222;
            auVar228._0_8_ = CONCAT44(fVar212,fVar187) & 0x7fffffff7fffffff;
            auVar228._8_4_ = ABS(fVar217);
            auVar228._12_4_ = ABS(fVar220);
            auVar147._0_8_ = CONCAT44(fVar103,fVar101) & 0x7fffffff7fffffff;
            auVar147._8_4_ = ABS(fVar111);
            auVar147._12_4_ = ABS(fVar113);
            auVar65 = maxps(auVar228,auVar147);
            auVar240._0_8_ =
                 CONCAT44(fVar54 * fStack_3a4 +
                          fVar97 * fStack_334 + fVar115 * fStack_1f4 + fVar141 * fStack_364,
                          fVar112 * local_3a8 +
                          fVar85 * local_338 + fVar110 * local_1f8 + fVar129 * local_368) &
                 0x7fffffff7fffffff;
            auVar240._8_4_ =
                 ABS(fVar83 * fStack_3a0 +
                     fVar99 * fStack_330 + fVar124 * fStack_1f0 + fVar142 * fStack_360);
            auVar240._12_4_ =
                 ABS(fVar84 * fStack_39c +
                     fVar102 * fStack_32c + fVar126 * fStack_1ec + fVar150 * fStack_35c);
            auVar65 = maxps(auVar65,auVar240);
            uVar49 = -(uint)(local_2d8 <= auVar65._0_4_);
            uVar50 = -(uint)(fStack_2d4 <= auVar65._4_4_);
            uVar51 = -(uint)(fStack_2d0 <= auVar65._8_4_);
            uVar52 = -(uint)(fStack_2cc <= auVar65._12_4_);
            auVar148._0_4_ = ~uVar49 & (uint)fVar234;
            auVar148._4_4_ = ~uVar50 & (uint)fVar207;
            auVar148._8_4_ = ~uVar51 & (uint)fVar209;
            auVar148._12_4_ = ~uVar52 & (uint)fVar210;
            auVar215._0_4_ = (uint)fVar187 & uVar49;
            auVar215._4_4_ = (uint)fVar212 & uVar50;
            auVar215._8_4_ = (uint)fVar217 & uVar51;
            auVar215._12_4_ = (uint)fVar220 & uVar52;
            auVar215 = auVar215 | auVar148;
            fVar115 = (float)(~uVar49 & (uint)fVar199 | (uint)fVar101 & uVar49);
            fVar124 = (float)(~uVar50 & (uint)fVar225 | (uint)fVar103 & uVar50);
            fVar126 = (float)(~uVar51 & (uint)fVar230 | (uint)fVar111 & uVar51);
            fVar101 = (float)(~uVar52 & (uint)fVar232 | (uint)fVar113 & uVar52);
            auVar241._0_8_ = CONCAT44(fVar246,fVar223) & 0x7fffffff7fffffff;
            auVar241._8_4_ = ABS(fVar247);
            auVar241._12_4_ = ABS(fVar248);
            auVar107._0_8_ = CONCAT44(fVar168,fVar128) & 0x7fffffff7fffffff;
            auVar107._8_4_ = ABS(fVar184);
            auVar107._12_4_ = ABS(fVar186);
            auVar65 = maxps(auVar241,auVar107);
            auVar80._0_8_ =
                 CONCAT44(fVar151 * fStack_3a4 +
                          fVar229 * fStack_334 + fVar167 * fStack_1f4 + fVar208 * fStack_364,
                          fVar143 * local_3a8 +
                          fVar224 * local_338 + fVar164 * local_1f8 + fVar205 * local_368) &
                 0x7fffffff7fffffff;
            auVar80._8_4_ =
                 ABS(fVar152 * fStack_3a0 +
                     fVar213 * fStack_330 + fVar183 * fStack_1f0 + fVar211 * fStack_360);
            auVar80._12_4_ =
                 ABS(fVar162 * fStack_39c +
                     fVar218 * fStack_32c + fVar185 * fStack_1ec + fVar222 * fStack_35c);
            auVar65 = maxps(auVar65,auVar80);
            uVar49 = -(uint)(local_2d8 <= auVar65._0_4_);
            uVar50 = -(uint)(fStack_2d4 <= auVar65._4_4_);
            uVar51 = -(uint)(fStack_2d0 <= auVar65._8_4_);
            uVar52 = -(uint)(fStack_2cc <= auVar65._12_4_);
            fVar211 = (float)((uint)fVar223 & uVar49 | ~uVar49 & (uint)fVar234);
            fVar222 = (float)((uint)fVar246 & uVar50 | ~uVar50 & (uint)fVar207);
            fVar234 = (float)((uint)fVar247 & uVar51 | ~uVar51 & (uint)fVar209);
            fVar209 = (float)((uint)fVar248 & uVar52 | ~uVar52 & (uint)fVar210);
            fVar167 = (float)(~uVar49 & (uint)fVar199 | (uint)fVar128 & uVar49);
            fVar185 = (float)(~uVar50 & (uint)fVar225 | (uint)fVar168 & uVar50);
            fVar205 = (float)(~uVar51 & (uint)fVar230 | (uint)fVar184 & uVar51);
            fVar208 = (float)(~uVar52 & (uint)fVar232 | (uint)fVar186 & uVar52);
            fVar110 = auVar215._0_4_;
            fVar112 = auVar215._4_4_;
            fVar54 = auVar215._8_4_;
            fVar83 = auVar215._12_4_;
            auVar137._0_4_ = fVar115 * fVar115 + fVar110 * fVar110;
            auVar137._4_4_ = fVar124 * fVar124 + fVar112 * fVar112;
            auVar137._8_4_ = fVar126 * fVar126 + fVar54 * fVar54;
            auVar137._12_4_ = fVar101 * fVar101 + fVar83 * fVar83;
            auVar65 = rsqrtps(auVar148,auVar137);
            fVar84 = auVar65._0_4_;
            fVar85 = auVar65._4_4_;
            fVar97 = auVar65._8_4_;
            fVar99 = auVar65._12_4_;
            auVar149._0_4_ = fVar84 * fVar84 * auVar137._0_4_ * 0.5 * fVar84;
            auVar149._4_4_ = fVar85 * fVar85 * auVar137._4_4_ * 0.5 * fVar85;
            auVar149._8_4_ = fVar97 * fVar97 * auVar137._8_4_ * 0.5 * fVar97;
            auVar149._12_4_ = fVar99 * fVar99 * auVar137._12_4_ * 0.5 * fVar99;
            fVar102 = fVar84 * 1.5 - auVar149._0_4_;
            fVar141 = fVar85 * 1.5 - auVar149._4_4_;
            fVar151 = fVar97 * 1.5 - auVar149._8_4_;
            fVar162 = fVar99 * 1.5 - auVar149._12_4_;
            auVar138._0_4_ = fVar167 * fVar167 + fVar211 * fVar211;
            auVar138._4_4_ = fVar185 * fVar185 + fVar222 * fVar222;
            auVar138._8_4_ = fVar205 * fVar205 + fVar234 * fVar234;
            auVar138._12_4_ = fVar208 * fVar208 + fVar209 * fVar209;
            auVar65 = rsqrtps(auVar149,auVar138);
            fVar84 = auVar65._0_4_;
            fVar85 = auVar65._4_4_;
            fVar97 = auVar65._8_4_;
            fVar99 = auVar65._12_4_;
            fVar129 = fVar84 * 1.5 - fVar84 * fVar84 * auVar138._0_4_ * 0.5 * fVar84;
            fVar142 = fVar85 * 1.5 - fVar85 * fVar85 * auVar138._4_4_ * 0.5 * fVar85;
            fVar143 = fVar97 * 1.5 - fVar97 * fVar97 * auVar138._8_4_ * 0.5 * fVar97;
            fVar150 = fVar99 * 1.5 - fVar99 * fVar99 * auVar138._12_4_ * 0.5 * fVar99;
            fVar229 = fVar115 * fVar102 * fVar188;
            fVar207 = fVar124 * fVar141 * fVar195;
            fVar210 = fVar126 * fVar151 * fVar197;
            fVar218 = fVar101 * fVar162 * fVar200;
            fVar110 = -fVar110 * fVar102 * fVar188;
            fVar115 = -fVar112 * fVar141 * fVar195;
            fVar124 = -fVar54 * fVar151 * fVar197;
            fVar126 = -fVar83 * fVar162 * fVar200;
            fVar152 = fVar102 * 0.0 * fVar188;
            fVar164 = fVar141 * 0.0 * fVar195;
            fVar183 = fVar151 * 0.0 * fVar197;
            fVar224 = fVar162 * 0.0 * fVar200;
            local_418._4_4_ = fVar116 + fVar164;
            uStack_410._0_4_ = fVar125 + fVar183;
            uStack_410._4_4_ = fVar127 + fVar224;
            fVar103 = fVar167 * fVar129 * auVar202._0_4_;
            fVar111 = fVar185 * fVar142 * auVar202._4_4_;
            fVar113 = fVar205 * fVar143 * auVar202._8_4_;
            fVar128 = fVar208 * fVar150 * auVar202._12_4_;
            fVar85 = fVar233 + fVar103;
            fVar97 = fVar235 + fVar111;
            fVar99 = fVar242 + fVar113;
            fVar102 = fVar243 + fVar128;
            fVar112 = -fVar211 * fVar129 * auVar202._0_4_;
            fVar54 = -fVar222 * fVar142 * auVar202._4_4_;
            fVar83 = -fVar234 * fVar143 * auVar202._8_4_;
            fVar84 = -fVar209 * fVar150 * auVar202._12_4_;
            fVar199 = fVar196 + fVar112;
            fVar225 = fVar198 + fVar54;
            fVar230 = fVar216 + fVar83;
            fVar232 = fVar219 + fVar84;
            fVar141 = fVar129 * 0.0 * auVar202._0_4_;
            fVar142 = fVar142 * 0.0 * auVar202._4_4_;
            fVar143 = fVar143 * 0.0 * auVar202._8_4_;
            fVar150 = fVar150 * 0.0 * auVar202._12_4_;
            fVar151 = fVar163 - fVar229;
            fVar162 = fVar165 - fVar207;
            fVar167 = fVar166 - fVar210;
            fVar185 = fVar189 - fVar218;
            fVar234 = fVar221 + fVar141;
            fVar209 = fVar86 + fVar142;
            fVar213 = fVar98 + fVar143;
            fVar101 = fVar100 + fVar150;
            fVar205 = fVar203 - fVar110;
            fVar208 = fVar204 - fVar115;
            fVar211 = fVar206 - fVar124;
            fVar222 = fVar231 - fVar126;
            fVar129 = fVar114 - fVar152;
            fVar116 = fVar116 - fVar164;
            fVar125 = fVar125 - fVar183;
            fVar127 = fVar127 - fVar224;
            uVar49 = -(uint)(0.0 < (fVar205 * (fVar234 - fVar129) - fVar129 * (fVar199 - fVar205)) *
                                   0.0 + (fVar129 * (fVar85 - fVar151) -
                                         (fVar234 - fVar129) * fVar151) * 0.0 +
                                         ((fVar199 - fVar205) * fVar151 -
                                         (fVar85 - fVar151) * fVar205));
            uVar50 = -(uint)(0.0 < (fVar208 * (fVar209 - fVar116) - fVar116 * (fVar225 - fVar208)) *
                                   0.0 + (fVar116 * (fVar97 - fVar162) -
                                         (fVar209 - fVar116) * fVar162) * 0.0 +
                                         ((fVar225 - fVar208) * fVar162 -
                                         (fVar97 - fVar162) * fVar208));
            uVar51 = -(uint)(0.0 < (fVar211 * (fVar213 - fVar125) - fVar125 * (fVar230 - fVar211)) *
                                   0.0 + (fVar125 * (fVar99 - fVar167) -
                                         (fVar213 - fVar125) * fVar167) * 0.0 +
                                         ((fVar230 - fVar211) * fVar167 -
                                         (fVar99 - fVar167) * fVar211));
            uVar52 = -(uint)(0.0 < (fVar222 * (fVar101 - fVar127) - fVar127 * (fVar232 - fVar222)) *
                                   0.0 + (fVar127 * (fVar102 - fVar185) -
                                         (fVar101 - fVar127) * fVar185) * 0.0 +
                                         ((fVar232 - fVar222) * fVar185 -
                                         (fVar102 - fVar185) * fVar222));
            local_428._0_4_ =
                 (uint)(fVar233 - fVar103) & uVar49 | ~uVar49 & (uint)(fVar163 + fVar229);
            local_428._4_4_ =
                 (uint)(fVar235 - fVar111) & uVar50 | ~uVar50 & (uint)(fVar165 + fVar207);
            fStack_420 = (float)((uint)(fVar242 - fVar113) & uVar51 |
                                ~uVar51 & (uint)(fVar166 + fVar210));
            fStack_41c = (float)((uint)(fVar243 - fVar128) & uVar52 |
                                ~uVar52 & (uint)(fVar189 + fVar218));
            fVar224 = (float)((uint)(fVar196 - fVar112) & uVar49 |
                             ~uVar49 & (uint)(fVar203 + fVar110));
            fVar229 = (float)((uint)(fVar198 - fVar54) & uVar50 |
                             ~uVar50 & (uint)(fVar204 + fVar115));
            fVar233 = (float)((uint)(fVar216 - fVar83) & uVar51 |
                             ~uVar51 & (uint)(fVar206 + fVar124));
            fVar231 = (float)((uint)(fVar219 - fVar84) & uVar52 |
                             ~uVar52 & (uint)(fVar231 + fVar126));
            fVar235 = (float)((uint)(fVar221 - fVar141) & uVar49 |
                             ~uVar49 & (uint)(fVar114 + fVar152));
            fVar242 = (float)((uint)(fVar86 - fVar142) & uVar50 | ~uVar50 & (uint)local_418._4_4_);
            fVar243 = (float)((uint)(fVar98 - fVar143) & uVar51 | ~uVar51 & (uint)(float)uStack_410)
            ;
            fVar163 = (float)((uint)(fVar100 - fVar150) & uVar52 | ~uVar52 & (uint)uStack_410._4_4_)
            ;
            fVar152 = (float)((uint)fVar151 & uVar49 | ~uVar49 & (uint)fVar85);
            fVar164 = (float)((uint)fVar162 & uVar50 | ~uVar50 & (uint)fVar97);
            fVar183 = (float)((uint)fVar167 & uVar51 | ~uVar51 & (uint)fVar99);
            fVar203 = (float)((uint)fVar185 & uVar52 | ~uVar52 & (uint)fVar102);
            fVar204 = (float)((uint)fVar205 & uVar49 | ~uVar49 & (uint)fVar199);
            fVar206 = (float)((uint)fVar208 & uVar50 | ~uVar50 & (uint)fVar225);
            fVar216 = (float)((uint)fVar211 & uVar51 | ~uVar51 & (uint)fVar230);
            fVar219 = (float)((uint)fVar222 & uVar52 | ~uVar52 & (uint)fVar232);
            fVar141 = (float)((uint)fVar129 & uVar49 | ~uVar49 & (uint)fVar234);
            fVar142 = (float)((uint)fVar116 & uVar50 | ~uVar50 & (uint)fVar209);
            fVar143 = (float)((uint)fVar125 & uVar51 | ~uVar51 & (uint)fVar213);
            fVar150 = (float)((uint)fVar127 & uVar52 | ~uVar52 & (uint)fVar101);
            fVar85 = (float)((uint)fVar85 & uVar49 | ~uVar49 & (uint)fVar151) -
                     (float)local_428._0_4_;
            fVar97 = (float)((uint)fVar97 & uVar50 | ~uVar50 & (uint)fVar162) -
                     (float)local_428._4_4_;
            fVar99 = (float)((uint)fVar99 & uVar51 | ~uVar51 & (uint)fVar167) - fStack_420;
            fVar102 = (float)((uint)fVar102 & uVar52 | ~uVar52 & (uint)fVar185) - fStack_41c;
            fVar151 = (float)((uint)fVar199 & uVar49 | ~uVar49 & (uint)fVar205) - fVar224;
            fVar162 = (float)((uint)fVar225 & uVar50 | ~uVar50 & (uint)fVar208) - fVar229;
            fVar167 = (float)((uint)fVar230 & uVar51 | ~uVar51 & (uint)fVar211) - fVar233;
            fVar185 = (float)((uint)fVar232 & uVar52 | ~uVar52 & (uint)fVar222) - fVar231;
            fVar129 = (float)((uint)fVar234 & uVar49 | ~uVar49 & (uint)fVar129) - fVar235;
            fVar205 = (float)((uint)fVar209 & uVar50 | ~uVar50 & (uint)fVar116) - fVar242;
            fVar208 = (float)((uint)fVar213 & uVar51 | ~uVar51 & (uint)fVar125) - fVar243;
            fVar211 = (float)((uint)fVar101 & uVar52 | ~uVar52 & (uint)fVar127) - fVar163;
            fVar196 = (float)local_428._0_4_ - fVar152;
            fVar198 = (float)local_428._4_4_ - fVar164;
            fVar199 = fStack_420 - fVar183;
            fVar225 = fStack_41c - fVar203;
            fVar112 = fVar224 - fVar204;
            fVar54 = fVar229 - fVar206;
            fVar83 = fVar233 - fVar216;
            fVar84 = fVar231 - fVar219;
            fVar110 = fVar235 - fVar141;
            fVar115 = fVar242 - fVar142;
            fVar124 = fVar243 - fVar143;
            fVar126 = fVar163 - fVar150;
            fVar222 = (fVar224 * fVar129 - fVar235 * fVar151) * 0.0 +
                      (fVar235 * fVar85 - (float)local_428._0_4_ * fVar129) * 0.0 +
                      ((float)local_428._0_4_ * fVar151 - fVar224 * fVar85);
            fVar165 = (fVar229 * fVar205 - fVar242 * fVar162) * 0.0 +
                      (fVar242 * fVar97 - (float)local_428._4_4_ * fVar205) * 0.0 +
                      ((float)local_428._4_4_ * fVar162 - fVar229 * fVar97);
            auVar122._4_4_ = fVar165;
            auVar122._0_4_ = fVar222;
            fVar166 = (fVar233 * fVar208 - fVar243 * fVar167) * 0.0 +
                      (fVar243 * fVar99 - fStack_420 * fVar208) * 0.0 +
                      (fStack_420 * fVar167 - fVar233 * fVar99);
            fVar189 = (fVar231 * fVar211 - fVar163 * fVar185) * 0.0 +
                      (fVar163 * fVar102 - fStack_41c * fVar211) * 0.0 +
                      (fStack_41c * fVar185 - fVar231 * fVar102);
            auVar245._0_4_ =
                 (fVar204 * fVar110 - fVar141 * fVar112) * 0.0 +
                 (fVar141 * fVar196 - fVar152 * fVar110) * 0.0 +
                 (fVar152 * fVar112 - fVar204 * fVar196);
            auVar245._4_4_ =
                 (fVar206 * fVar115 - fVar142 * fVar54) * 0.0 +
                 (fVar142 * fVar198 - fVar164 * fVar115) * 0.0 +
                 (fVar164 * fVar54 - fVar206 * fVar198);
            auVar245._8_4_ =
                 (fVar216 * fVar124 - fVar143 * fVar83) * 0.0 +
                 (fVar143 * fVar199 - fVar183 * fVar124) * 0.0 +
                 (fVar183 * fVar83 - fVar216 * fVar199);
            auVar245._12_4_ =
                 (fVar219 * fVar126 - fVar150 * fVar84) * 0.0 +
                 (fVar150 * fVar225 - fVar203 * fVar126) * 0.0 +
                 (fVar203 * fVar84 - fVar219 * fVar225);
            auVar122._8_4_ = fVar166;
            auVar122._12_4_ = fVar189;
            auVar65 = maxps(auVar122,auVar245);
            bVar33 = auVar65._0_4_ <= 0.0 && bVar33;
            auVar123._0_4_ = -(uint)bVar33;
            bVar34 = auVar65._4_4_ <= 0.0 && bVar34;
            auVar123._4_4_ = -(uint)bVar34;
            bVar32 = auVar65._8_4_ <= 0.0 && bVar32;
            auVar123._8_4_ = -(uint)bVar32;
            bVar31 = auVar65._12_4_ <= 0.0 && bVar31;
            auVar123._12_4_ = -(uint)bVar31;
            iVar35 = movmskps((int)puVar38,auVar123);
            if (iVar35 == 0) {
LAB_00b65f25:
              iVar35 = 0;
              auVar109._8_8_ = uStack_310;
              auVar109._0_8_ = local_318;
            }
            else {
              fVar141 = ray->tfar;
              fVar142 = fVar112 * fVar129 - fVar110 * fVar151;
              fVar143 = fVar54 * fVar205 - fVar115 * fVar162;
              fVar150 = fVar83 * fVar208 - fVar124 * fVar167;
              fVar152 = fVar84 * fVar211 - fVar126 * fVar185;
              fVar110 = fVar110 * fVar85 - fVar129 * fVar196;
              fVar115 = fVar115 * fVar97 - fVar205 * fVar198;
              fVar124 = fVar124 * fVar99 - fVar208 * fVar199;
              fVar126 = fVar126 * fVar102 - fVar211 * fVar225;
              fVar85 = fVar196 * fVar151 - fVar112 * fVar85;
              fVar97 = fVar198 * fVar162 - fVar54 * fVar97;
              fVar99 = fVar199 * fVar167 - fVar83 * fVar99;
              fVar102 = fVar225 * fVar185 - fVar84 * fVar102;
              auVar108._0_4_ = fVar110 * 0.0 + fVar85;
              auVar108._4_4_ = fVar115 * 0.0 + fVar97;
              auVar108._8_4_ = fVar124 * 0.0 + fVar99;
              auVar108._12_4_ = fVar126 * 0.0 + fVar102;
              auVar161._0_4_ = fVar142 * 0.0 + auVar108._0_4_;
              auVar161._4_4_ = fVar143 * 0.0 + auVar108._4_4_;
              auVar161._8_4_ = fVar150 * 0.0 + auVar108._8_4_;
              auVar161._12_4_ = fVar152 * 0.0 + auVar108._12_4_;
              auVar65 = rcpps(auVar108,auVar161);
              fVar112 = auVar65._0_4_;
              fVar54 = auVar65._4_4_;
              fVar83 = auVar65._8_4_;
              fVar84 = auVar65._12_4_;
              fVar112 = (1.0 - auVar161._0_4_ * fVar112) * fVar112 + fVar112;
              fVar54 = (1.0 - auVar161._4_4_ * fVar54) * fVar54 + fVar54;
              fVar83 = (1.0 - auVar161._8_4_ * fVar83) * fVar83 + fVar83;
              fVar84 = (1.0 - auVar161._12_4_ * fVar84) * fVar84 + fVar84;
              fVar85 = (fVar235 * fVar85 + fVar224 * fVar110 + (float)local_428._0_4_ * fVar142) *
                       fVar112;
              fVar97 = (fVar242 * fVar97 + fVar229 * fVar115 + (float)local_428._4_4_ * fVar143) *
                       fVar54;
              fVar99 = (fVar243 * fVar99 + fVar233 * fVar124 + fStack_420 * fVar150) * fVar83;
              fVar102 = (fVar163 * fVar102 + fVar231 * fVar126 + fStack_41c * fVar152) * fVar84;
              bVar33 = ((float)local_228._0_4_ <= fVar85 && fVar85 <= fVar141) && bVar33;
              auVar139._0_4_ = -(uint)bVar33;
              bVar34 = ((float)local_228._4_4_ <= fVar97 && fVar97 <= fVar141) && bVar34;
              auVar139._4_4_ = -(uint)bVar34;
              bVar32 = (fStack_220 <= fVar99 && fVar99 <= fVar141) && bVar32;
              auVar139._8_4_ = -(uint)bVar32;
              bVar31 = (fStack_21c <= fVar102 && fVar102 <= fVar141) && bVar31;
              auVar139._12_4_ = -(uint)bVar31;
              iVar35 = movmskps(iVar35,auVar139);
              if (iVar35 == 0) goto LAB_00b65f25;
              auVar140._0_8_ =
                   CONCAT44(-(uint)(auVar161._4_4_ != 0.0 && bVar34),
                            -(uint)(auVar161._0_4_ != 0.0 && bVar33));
              auVar140._8_4_ = -(uint)(auVar161._8_4_ != 0.0 && bVar32);
              auVar140._12_4_ = -(uint)(auVar161._12_4_ != 0.0 && bVar31);
              iVar35 = movmskps(iVar35,auVar140);
              auVar109._8_8_ = uStack_310;
              auVar109._0_8_ = local_318;
              if (iVar35 != 0) {
                fVar222 = fVar222 * fVar112;
                fVar165 = fVar165 * fVar54;
                fVar166 = fVar166 * fVar83;
                fVar189 = fVar189 * fVar84;
                local_b8 = (float)((uint)(1.0 - fVar222) & uVar49 | ~uVar49 & (uint)fVar222);
                fStack_b4 = (float)((uint)(1.0 - fVar165) & uVar50 | ~uVar50 & (uint)fVar165);
                fStack_b0 = (float)((uint)(1.0 - fVar166) & uVar51 | ~uVar51 & (uint)fVar166);
                fStack_ac = (float)((uint)(1.0 - fVar189) & uVar52 | ~uVar52 & (uint)fVar189);
                local_1e8 = (float)(~uVar49 & (uint)(auVar245._0_4_ * fVar112) |
                                   (uint)(1.0 - auVar245._0_4_ * fVar112) & uVar49);
                fStack_1e4 = (float)(~uVar50 & (uint)(auVar245._4_4_ * fVar54) |
                                    (uint)(1.0 - auVar245._4_4_ * fVar54) & uVar50);
                fStack_1e0 = (float)(~uVar51 & (uint)(auVar245._8_4_ * fVar83) |
                                    (uint)(1.0 - auVar245._8_4_ * fVar83) & uVar51);
                fStack_1dc = (float)(~uVar52 & (uint)(auVar245._12_4_ * fVar84) |
                                    (uint)(1.0 - auVar245._12_4_ * fVar84) & uVar52);
                auVar109._8_4_ = auVar140._8_4_;
                auVar109._0_8_ = auVar140._0_8_;
                auVar109._12_4_ = auVar140._12_4_;
                local_c8 = fVar85;
                fStack_c4 = fVar97;
                fStack_c0 = fVar99;
                fStack_bc = fVar102;
              }
            }
            _Stack_110 = CONCAT44(fStack_2fc,fStack_300);
            local_118 = (_func_int **)CONCAT44(fStack_304,local_308);
            uStack_280 = CONCAT44(fStack_2ec,fStack_2f0);
            local_288 = local_2f8;
            fStack_284 = fStack_2f4;
            _Stack_3f0._4_4_ = fStack_2dc;
            _Stack_3f0._0_4_ = aStack_2e0;
            local_3f8._0_4_ = local_2e8;
            local_3f8._4_4_ = fStack_2e4;
            uVar49 = movmskps(iVar35,auVar109);
            puVar38 = (undefined1 *)(ulong)uVar49;
            fVar143 = local_378;
            fVar222 = fStack_374;
            fVar224 = fStack_370;
            fVar229 = fStack_36c;
            if (uVar49 == 0) goto LAB_00b65ec1;
            fVar188 = (auVar202._0_4_ - fVar188) * local_b8 + fVar188;
            fVar195 = (auVar202._4_4_ - fVar195) * fStack_b4 + fVar195;
            fVar197 = (auVar202._8_4_ - fVar197) * fStack_b0 + fVar197;
            fVar200 = (auVar202._12_4_ - fVar200) * fStack_ac + fVar200;
            fVar112 = local_350->depth_scale;
            local_108._0_4_ = -(uint)(fVar112 * (fVar188 + fVar188) < local_c8) & auVar109._0_4_;
            local_108._4_4_ = -(uint)(fVar112 * (fVar195 + fVar195) < fStack_c4) & auVar109._4_4_;
            local_108._8_4_ = -(uint)(fVar112 * (fVar197 + fVar197) < fStack_c0) & auVar109._8_4_;
            local_108._12_4_ = -(uint)(fVar112 * (fVar200 + fVar200) < fStack_bc) & auVar109._12_4_;
            iVar35 = movmskps(uVar49,local_108);
            if (iVar35 != 0) {
              local_1e8 = local_1e8 + local_1e8 + -1.0;
              fStack_1e4 = fStack_1e4 + fStack_1e4 + -1.0;
              fStack_1e0 = fStack_1e0 + fStack_1e0 + -1.0;
              fStack_1dc = fStack_1dc + fStack_1dc + -1.0;
              local_188 = local_b8;
              fStack_184 = fStack_b4;
              fStack_180 = fStack_b0;
              fStack_17c = fStack_ac;
              local_168._4_4_ = fStack_c4;
              local_168._0_4_ = local_c8;
              fStack_160 = fStack_c0;
              fStack_15c = fStack_bc;
              local_148 = local_3d8;
              fStack_144 = fStack_3d4;
              fStack_140 = fStack_3d0;
              fStack_13c = fStack_3cc;
              auVar37 = (undefined1  [8])(local_3c0->scene->geometries).items[local_320].ptr;
              if ((((Geometry *)auVar37)->mask & ray->mask) == 0) {
                bVar40 = 0;
              }
              else if ((local_3c0->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar40 = 1,
                      ((Geometry *)auVar37)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar112 = (float)(int)local_158;
                local_f8[0] = (fVar112 + local_b8 + 0.0) * (float)local_238._0_4_;
                local_f8[1] = (fVar112 + fStack_b4 + 1.0) * (float)local_238._4_4_;
                local_f8[2] = (fVar112 + fStack_b0 + 2.0) * fStack_230;
                local_f8[3] = (fVar112 + fStack_ac + 3.0) * fStack_22c;
                local_e8 = CONCAT44(fStack_1e4,local_1e8);
                uStack_e0 = CONCAT44(fStack_1dc,fStack_1e0);
                local_d8._4_4_ = fStack_c4;
                local_d8._0_4_ = local_c8;
                local_d8._12_4_ = fStack_bc;
                local_d8._8_4_ = fStack_c0;
                uVar45 = (ulong)(byte)iVar35;
                lVar42 = 0;
                if (uVar45 != 0) {
                  for (; ((byte)iVar35 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                  }
                }
                uStack_390 = _Stack_110;
                local_398 = (undefined1  [8])local_118;
                local_418._0_4_ = (float)(int)CONCAT71((uint7)(uint3)((uint)iVar35 >> 8),1);
                uStack_380 = auVar202._8_8_;
                local_388 = auVar37;
                local_178 = local_1e8;
                fStack_174 = fStack_1e4;
                fStack_170 = fStack_1e0;
                fStack_16c = fStack_1dc;
                local_154 = iVar10;
                _Stack_130 = _Stack_3f0;
                _Stack_120 = uStack_280;
                local_128._0_4_ = local_288;
                local_128._4_4_ = fStack_284;
                local_138._0_4_ = (float)local_3f8;
                local_138._4_4_ = local_3f8._4_4_;
                do {
                  local_26c = local_f8[lVar42];
                  local_268 = *(undefined4 *)((long)&local_e8 + lVar42 * 4);
                  local_348._0_4_ = ray->tfar;
                  local_428 = (undefined1  [8])lVar42;
                  ray->tfar = *(float *)(local_d8 + lVar42 * 4);
                  fVar112 = 1.0 - local_26c;
                  fVar83 = local_26c * 3.0;
                  fVar84 = ((fVar83 + 2.0) * (fVar112 + fVar112) + fVar112 * -3.0 * fVar112) * 0.5;
                  fVar54 = (fVar112 * -2.0 * local_26c + local_26c * local_26c) * 0.5;
                  fVar83 = (local_26c * fVar83 + (fVar83 + -5.0) * (local_26c + local_26c)) * 0.5;
                  fVar112 = (local_26c * (fVar112 + fVar112) - fVar112 * fVar112) * 0.5;
                  local_278 = CONCAT44(fVar112 * fStack_3d4 +
                                       fVar83 * local_3f8._4_4_ +
                                       fVar84 * fStack_284 + fVar54 * (float)local_398._4_4_,
                                       fVar112 * local_3d8 +
                                       fVar83 * (float)local_3f8 +
                                       fVar84 * local_288 + fVar54 * (float)local_398._0_4_);
                  local_270 = fVar112 * fStack_3d0 +
                              fVar83 * (float)_Stack_3f0._0_4_ +
                              fVar84 * (float)uStack_280 + fVar54 * (float)uStack_390;
                  local_2c8.context = local_3c0->user;
                  local_264 = (undefined4)local_240;
                  local_260 = (undefined4)local_320;
                  local_25c = (local_2c8.context)->instID[0];
                  local_258 = (local_2c8.context)->instPrimID[0];
                  local_42c = (undefined1  [4])0xffffffff;
                  local_2c8.valid = (int *)local_42c;
                  local_2c8.geometryUserPtr = ((Geometry *)auVar37)->userPtr;
                  local_2c8.hit = (RTCHitN *)&local_278;
                  local_2c8.N = 1;
                  local_2c8.ray = (RTCRayN *)ray;
                  if (((Geometry *)auVar37)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b65dd2:
                    p_Var39 = local_3c0->args->filter;
                    if (p_Var39 == (RTCFilterFunctionN)0x0) break;
                    if (((local_3c0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((((Geometry *)auVar37)->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var39)(&local_2c8);
                      auVar37 = local_388;
                    }
                    p_Var39 = (RTCFilterFunctionN)local_2c8.valid;
                    if (*local_2c8.valid != 0) break;
                  }
                  else {
                    (*((Geometry *)auVar37)->occlusionFilterN)(&local_2c8);
                    auVar37 = local_388;
                    if (*local_2c8.valid != 0) goto LAB_00b65dd2;
                  }
                  ray->tfar = (float)local_348._0_4_;
                  uVar45 = uVar45 ^ 1L << ((ulong)local_428 & 0x3f);
                  lVar42 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                    }
                  }
                  p_Var39 = (RTCFilterFunctionN)CONCAT71(local_428._1_7_,uVar45 != 0);
                  local_418._0_4_ = (float)(int)p_Var39;
                } while (uVar45 != 0);
                iVar35 = (int)p_Var39;
                bVar40 = (byte)local_418 & 1;
              }
              bVar48 = (bool)(bVar48 | bVar40);
              fVar143 = local_378;
              fVar222 = fStack_374;
              fVar224 = fStack_370;
              fVar229 = fStack_36c;
            }
          }
          lVar43 = lVar43 + 4;
          fVar99 = local_408;
          fVar211 = fStack_404;
          fVar216 = fStack_400;
          fVar219 = fStack_3fc;
        } while ((int)lVar43 < iVar10);
      }
      if (bVar48 != false) {
        return bVar47;
      }
      fVar112 = ray->tfar;
      auVar96._4_4_ = -(uint)(fStack_44 <= fVar112);
      auVar96._0_4_ = -(uint)(local_48 <= fVar112);
      auVar96._8_4_ = -(uint)(fStack_40 <= fVar112);
      auVar96._12_4_ = -(uint)(fStack_3c <= fVar112);
      uVar49 = movmskps(iVar35,auVar96);
      uVar49 = (uint)uVar46 & uVar49;
      bVar47 = uVar49 != 0;
      context = local_3c0;
      pre = local_350;
    } while (bVar47);
  }
  return bVar47;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }